

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNvIntersectorK<8,16>::
intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
          (CurveNvIntersectorK<8,16> *this,Precalculations *pre,RayHitK<16> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  Vector *pVVar5;
  uint *puVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  ulong uVar88;
  ulong uVar89;
  byte bVar90;
  int iVar91;
  byte bVar92;
  long lVar93;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  bool bVar94;
  undefined1 uVar95;
  undefined1 uVar96;
  ulong uVar97;
  uint uVar98;
  uint uVar162;
  uint uVar163;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  uint uVar164;
  uint uVar168;
  undefined1 auVar159 [32];
  undefined1 auVar107 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float pp;
  float fVar169;
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar184;
  undefined1 auVar183 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar185;
  float fVar186;
  undefined4 uVar187;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar228;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar248 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [32];
  undefined1 auVar251 [16];
  undefined1 auVar255 [32];
  undefined1 auVar253 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [28];
  undefined1 auVar270 [64];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  undefined1 auVar274 [32];
  undefined1 auVar275 [64];
  undefined1 auVar276 [32];
  float fVar277;
  undefined1 auVar278 [64];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  undefined1 in_ZMM31 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  undefined1 *local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  Precalculations *local_ad8;
  int *local_ad0;
  undefined4 local_ac8;
  undefined1 local_ac0 [32];
  undefined1 (*local_aa0) [32];
  long local_a98;
  RayQueryContext *local_a90;
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [64];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [64];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  
  bVar84 = *(byte *)((long)&context->scene + 1);
  uVar97 = (ulong)bVar84;
  lVar93 = (long)context + uVar97 * 0x19 + 0x16;
  fVar277 = *(float *)((long)context + uVar97 * 0x19 + 0x12);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x40)),
                           ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x20
                          );
  auVar21 = vinsertps_avx(ZEXT416((uint)pre->ray_space[4].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[5].vy.field_0.m128[(long)ray]),0x10);
  auVar106 = vinsertps_avx(auVar21,ZEXT416((uint)pre->ray_space[6].vz.field_0.m128[(long)ray]),0x20)
  ;
  auVar108 = vsubps_avx(auVar101,*(undefined1 (*) [16])((long)context + uVar97 * 0x19 + 6));
  fVar228 = fVar277 * auVar108._0_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 4 + 6);
  auVar118 = vpmovsxbd_avx2(auVar101);
  fVar169 = fVar277 * auVar106._0_4_;
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 5 + 6);
  auVar116 = vpmovsxbd_avx2(auVar21);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 6 + 6);
  auVar119 = vpmovsxbd_avx2(auVar102);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 0xb + 6);
  auVar120 = vpmovsxbd_avx2(auVar103);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 0xc + 6);
  auVar121 = vpmovsxbd_avx2(auVar99);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 0xd + 6);
  auVar117 = vpmovsxbd_avx2(auVar112);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 0x12 + 6);
  auVar122 = vpmovsxbd_avx2(auVar104);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 0x13 + 6);
  auVar123 = vpmovsxbd_avx2(auVar100);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)((long)&context->scene + uVar97 * 0x14 + 6);
  auVar125 = vpmovsxbd_avx2(auVar105);
  auVar124 = vcvtdq2ps_avx(auVar125);
  auVar136._8_4_ = 1;
  auVar136._0_8_ = 0x100000001;
  auVar136._12_4_ = 1;
  auVar136._16_4_ = 1;
  auVar136._20_4_ = 1;
  auVar136._24_4_ = 1;
  auVar136._28_4_ = 1;
  auVar134._4_4_ = fVar169;
  auVar134._0_4_ = fVar169;
  auVar134._8_4_ = fVar169;
  auVar134._12_4_ = fVar169;
  auVar134._16_4_ = fVar169;
  auVar134._20_4_ = fVar169;
  auVar134._24_4_ = fVar169;
  auVar134._28_4_ = fVar169;
  auVar115 = ZEXT1632(CONCAT412(fVar277 * auVar106._12_4_,
                                CONCAT48(fVar277 * auVar106._8_4_,
                                         CONCAT44(fVar277 * auVar106._4_4_,fVar169))));
  auVar126 = vpermps_avx2(auVar136,auVar115);
  auVar113 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar114 = vpermps_avx512vl(auVar113,auVar115);
  fVar169 = auVar114._0_4_;
  auVar183._0_4_ = fVar169 * auVar119._0_4_;
  fVar184 = auVar114._4_4_;
  auVar183._4_4_ = fVar184 * auVar119._4_4_;
  fVar185 = auVar114._8_4_;
  auVar183._8_4_ = fVar185 * auVar119._8_4_;
  fVar198 = auVar114._12_4_;
  auVar183._12_4_ = fVar198 * auVar119._12_4_;
  fVar200 = auVar114._16_4_;
  auVar183._16_4_ = fVar200 * auVar119._16_4_;
  fVar202 = auVar114._20_4_;
  auVar183._20_4_ = fVar202 * auVar119._20_4_;
  fVar170 = auVar114._24_4_;
  auVar183._28_36_ = in_ZMM4._28_36_;
  auVar183._24_4_ = fVar170 * auVar119._24_4_;
  auVar115._4_4_ = auVar117._4_4_ * fVar184;
  auVar115._0_4_ = auVar117._0_4_ * fVar169;
  auVar115._8_4_ = auVar117._8_4_ * fVar185;
  auVar115._12_4_ = auVar117._12_4_ * fVar198;
  auVar115._16_4_ = auVar117._16_4_ * fVar200;
  auVar115._20_4_ = auVar117._20_4_ * fVar202;
  auVar115._24_4_ = auVar117._24_4_ * fVar170;
  auVar115._28_4_ = auVar125._28_4_;
  auVar125._4_4_ = fVar184 * auVar124._4_4_;
  auVar125._0_4_ = fVar169 * auVar124._0_4_;
  auVar125._8_4_ = fVar185 * auVar124._8_4_;
  auVar125._12_4_ = fVar198 * auVar124._12_4_;
  auVar125._16_4_ = fVar200 * auVar124._16_4_;
  auVar125._20_4_ = fVar202 * auVar124._20_4_;
  auVar125._24_4_ = fVar170 * auVar124._24_4_;
  auVar125._28_4_ = auVar114._28_4_;
  auVar101 = vfmadd231ps_fma(auVar183._0_32_,auVar126,auVar116);
  auVar21 = vfmadd231ps_fma(auVar115,auVar126,auVar121);
  auVar102 = vfmadd231ps_fma(auVar125,auVar123,auVar126);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar134,auVar118);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar134,auVar120);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar122,auVar134);
  auVar135._4_4_ = fVar228;
  auVar135._0_4_ = fVar228;
  auVar135._8_4_ = fVar228;
  auVar135._12_4_ = fVar228;
  auVar135._16_4_ = fVar228;
  auVar135._20_4_ = fVar228;
  auVar135._24_4_ = fVar228;
  auVar135._28_4_ = fVar228;
  auVar126 = ZEXT1632(CONCAT412(fVar277 * auVar108._12_4_,
                                CONCAT48(fVar277 * auVar108._8_4_,
                                         CONCAT44(fVar277 * auVar108._4_4_,fVar228))));
  auVar125 = vpermps_avx2(auVar136,auVar126);
  auVar115 = vpermps_avx512vl(auVar113,auVar126);
  fVar277 = auVar115._0_4_;
  fVar169 = auVar115._4_4_;
  auVar126._4_4_ = fVar169 * auVar119._4_4_;
  auVar126._0_4_ = fVar277 * auVar119._0_4_;
  fVar184 = auVar115._8_4_;
  auVar126._8_4_ = fVar184 * auVar119._8_4_;
  fVar185 = auVar115._12_4_;
  auVar126._12_4_ = fVar185 * auVar119._12_4_;
  fVar198 = auVar115._16_4_;
  auVar126._16_4_ = fVar198 * auVar119._16_4_;
  fVar200 = auVar115._20_4_;
  auVar126._20_4_ = fVar200 * auVar119._20_4_;
  fVar202 = auVar115._24_4_;
  auVar126._24_4_ = fVar202 * auVar119._24_4_;
  auVar126._28_4_ = auVar119._28_4_;
  auVar129._0_4_ = fVar277 * auVar117._0_4_;
  auVar129._4_4_ = fVar169 * auVar117._4_4_;
  auVar129._8_4_ = fVar184 * auVar117._8_4_;
  auVar129._12_4_ = fVar185 * auVar117._12_4_;
  auVar129._16_4_ = fVar198 * auVar117._16_4_;
  auVar129._20_4_ = fVar200 * auVar117._20_4_;
  auVar129._24_4_ = fVar202 * auVar117._24_4_;
  auVar129._28_4_ = 0;
  auVar117._4_4_ = fVar169 * auVar124._4_4_;
  auVar117._0_4_ = fVar277 * auVar124._0_4_;
  auVar117._8_4_ = fVar184 * auVar124._8_4_;
  auVar117._12_4_ = fVar185 * auVar124._12_4_;
  auVar117._16_4_ = fVar198 * auVar124._16_4_;
  auVar117._20_4_ = fVar200 * auVar124._20_4_;
  auVar117._24_4_ = fVar202 * auVar124._24_4_;
  auVar117._28_4_ = auVar124._28_4_;
  auVar103 = vfmadd231ps_fma(auVar126,auVar125,auVar116);
  auVar99 = vfmadd231ps_fma(auVar129,auVar125,auVar121);
  auVar112 = vfmadd231ps_fma(auVar117,auVar125,auVar123);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar135,auVar118);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar135,auVar120);
  auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar135,auVar122);
  auVar131._8_4_ = 0x7fffffff;
  auVar131._0_8_ = 0x7fffffff7fffffff;
  auVar131._12_4_ = 0x7fffffff;
  auVar131._16_4_ = 0x7fffffff;
  auVar131._20_4_ = 0x7fffffff;
  auVar131._24_4_ = 0x7fffffff;
  auVar131._28_4_ = 0x7fffffff;
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar133._16_4_ = 0x219392ef;
  auVar133._20_4_ = 0x219392ef;
  auVar133._24_4_ = 0x219392ef;
  auVar133._28_4_ = 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar101),auVar131);
  uVar88 = vcmpps_avx512vl(auVar118,auVar133,1);
  bVar94 = (bool)((byte)uVar88 & 1);
  auVar113._0_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar101._0_4_;
  bVar94 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar101._4_4_;
  bVar94 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar101._8_4_;
  bVar94 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar101._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar21),auVar131);
  uVar88 = vcmpps_avx512vl(auVar118,auVar133,1);
  bVar94 = (bool)((byte)uVar88 & 1);
  auVar114._0_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar21._0_4_;
  bVar94 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar21._4_4_;
  bVar94 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar21._8_4_;
  bVar94 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar21._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar102),auVar131);
  uVar88 = vcmpps_avx512vl(auVar118,auVar133,1);
  bVar94 = (bool)((byte)uVar88 & 1);
  auVar118._0_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar102._0_4_;
  bVar94 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar118._4_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar102._4_4_;
  bVar94 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar118._8_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar102._8_4_;
  bVar94 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar118._12_4_ = (uint)bVar94 * 0x219392ef | (uint)!bVar94 * auVar102._12_4_;
  auVar118._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar118._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar118._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar118._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar116 = vrcp14ps_avx512vl(auVar113);
  auVar132._8_4_ = 0x3f800000;
  auVar132._0_8_ = 0x3f8000003f800000;
  auVar132._12_4_ = 0x3f800000;
  auVar132._16_4_ = 0x3f800000;
  auVar132._20_4_ = 0x3f800000;
  auVar132._24_4_ = 0x3f800000;
  auVar132._28_4_ = 0x3f800000;
  auVar101 = vfnmadd213ps_fma(auVar113,auVar116,auVar132);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar114);
  auVar21 = vfnmadd213ps_fma(auVar114,auVar116,auVar132);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar116,auVar116);
  auVar116 = vrcp14ps_avx512vl(auVar118);
  auVar102 = vfnmadd213ps_fma(auVar118,auVar116,auVar132);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar116,auVar116);
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar97 * 7 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar103));
  auVar122._4_4_ = auVar101._4_4_ * auVar118._4_4_;
  auVar122._0_4_ = auVar101._0_4_ * auVar118._0_4_;
  auVar122._8_4_ = auVar101._8_4_ * auVar118._8_4_;
  auVar122._12_4_ = auVar101._12_4_ * auVar118._12_4_;
  auVar122._16_4_ = auVar118._16_4_ * 0.0;
  auVar122._20_4_ = auVar118._20_4_ * 0.0;
  auVar122._24_4_ = auVar118._24_4_ * 0.0;
  auVar122._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar97 * 9 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar103));
  auVar130._0_4_ = auVar101._0_4_ * auVar118._0_4_;
  auVar130._4_4_ = auVar101._4_4_ * auVar118._4_4_;
  auVar130._8_4_ = auVar101._8_4_ * auVar118._8_4_;
  auVar130._12_4_ = auVar101._12_4_ * auVar118._12_4_;
  auVar130._16_4_ = auVar118._16_4_ * 0.0;
  auVar130._20_4_ = auVar118._20_4_ * 0.0;
  auVar130._24_4_ = auVar118._24_4_ * 0.0;
  auVar130._28_4_ = 0;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar97 * 0xe + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar99));
  auVar123._4_4_ = auVar21._4_4_ * auVar118._4_4_;
  auVar123._0_4_ = auVar21._0_4_ * auVar118._0_4_;
  auVar123._8_4_ = auVar21._8_4_ * auVar118._8_4_;
  auVar123._12_4_ = auVar21._12_4_ * auVar118._12_4_;
  auVar123._16_4_ = auVar118._16_4_ * 0.0;
  auVar123._20_4_ = auVar118._20_4_ * 0.0;
  auVar123._24_4_ = auVar118._24_4_ * 0.0;
  auVar123._28_4_ = auVar118._28_4_;
  auVar117 = vpbroadcastd_avx512vl();
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar84 * 0x10 + 6)
                           );
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar99));
  auVar116 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar97 * 0x15 + 6));
  auVar128._0_4_ = auVar21._0_4_ * auVar118._0_4_;
  auVar128._4_4_ = auVar21._4_4_ * auVar118._4_4_;
  auVar128._8_4_ = auVar21._8_4_ * auVar118._8_4_;
  auVar128._12_4_ = auVar21._12_4_ * auVar118._12_4_;
  auVar128._16_4_ = auVar118._16_4_ * 0.0;
  auVar128._20_4_ = auVar118._20_4_ * 0.0;
  auVar128._24_4_ = auVar118._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar118 = vcvtdq2ps_avx(auVar116);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar112));
  auVar124._4_4_ = auVar118._4_4_ * auVar102._4_4_;
  auVar124._0_4_ = auVar118._0_4_ * auVar102._0_4_;
  auVar124._8_4_ = auVar118._8_4_ * auVar102._8_4_;
  auVar124._12_4_ = auVar118._12_4_ * auVar102._12_4_;
  auVar124._16_4_ = auVar118._16_4_ * 0.0;
  auVar124._20_4_ = auVar118._20_4_ * 0.0;
  auVar124._24_4_ = auVar118._24_4_ * 0.0;
  auVar124._28_4_ = auVar118._28_4_;
  auVar118 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar97 * 0x17 + 6));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,ZEXT1632(auVar112));
  auVar127._0_4_ = auVar102._0_4_ * auVar118._0_4_;
  auVar127._4_4_ = auVar102._4_4_ * auVar118._4_4_;
  auVar127._8_4_ = auVar102._8_4_ * auVar118._8_4_;
  auVar127._12_4_ = auVar102._12_4_ * auVar118._12_4_;
  auVar127._16_4_ = auVar118._16_4_ * 0.0;
  auVar127._20_4_ = auVar118._20_4_ * 0.0;
  auVar127._24_4_ = auVar118._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar118 = vpminsd_avx2(auVar122,auVar130);
  auVar116 = vpminsd_avx2(auVar123,auVar128);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116 = vpminsd_avx2(auVar124,auVar127);
  uVar187 = *(undefined4 *)((long)&pre->ray_space[2].vz.field_0 + (long)ray * 4);
  auVar119._4_4_ = uVar187;
  auVar119._0_4_ = uVar187;
  auVar119._8_4_ = uVar187;
  auVar119._12_4_ = uVar187;
  auVar119._16_4_ = uVar187;
  auVar119._20_4_ = uVar187;
  auVar119._24_4_ = uVar187;
  auVar119._28_4_ = uVar187;
  auVar116 = vmaxps_avx512vl(auVar116,auVar119);
  auVar118 = vmaxps_avx(auVar118,auVar116);
  auVar116._8_4_ = 0x3f7ffffa;
  auVar116._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar116._12_4_ = 0x3f7ffffa;
  auVar116._16_4_ = 0x3f7ffffa;
  auVar116._20_4_ = 0x3f7ffffa;
  auVar116._24_4_ = 0x3f7ffffa;
  auVar116._28_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar118,auVar116);
  auVar118 = vpmaxsd_avx2(auVar122,auVar130);
  auVar116 = vpmaxsd_avx2(auVar123,auVar128);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar116 = vpmaxsd_avx2(auVar124,auVar127);
  uVar187 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
  auVar120._4_4_ = uVar187;
  auVar120._0_4_ = uVar187;
  auVar120._8_4_ = uVar187;
  auVar120._12_4_ = uVar187;
  auVar120._16_4_ = uVar187;
  auVar120._20_4_ = uVar187;
  auVar120._24_4_ = uVar187;
  auVar120._28_4_ = uVar187;
  auVar116 = vminps_avx512vl(auVar116,auVar120);
  auVar118 = vminps_avx(auVar118,auVar116);
  auVar121._8_4_ = 0x3f800003;
  auVar121._0_8_ = 0x3f8000033f800003;
  auVar121._12_4_ = 0x3f800003;
  auVar121._16_4_ = 0x3f800003;
  auVar121._20_4_ = 0x3f800003;
  auVar121._24_4_ = 0x3f800003;
  auVar121._28_4_ = 0x3f800003;
  auVar118 = vmulps_avx512vl(auVar118,auVar121);
  uVar22 = vcmpps_avx512vl(local_5a0,auVar118,2);
  uVar24 = vpcmpgtd_avx512vl(auVar117,_DAT_01fb4ba0);
  local_a88 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar22 & (byte)uVar24));
  local_aa0 = (undefined1 (*) [32])local_240;
  auVar183 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar183);
  local_a98 = lVar93;
  local_a90 = context;
LAB_019a9727:
  iVar91 = 1;
  if (local_a88 == 0) {
    return;
  }
  lVar25 = 0;
  for (uVar88 = local_a88; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  local_a88 = local_a88 - 1 & local_a88;
  fVar277 = *(float *)((long)&context->scene + lVar25 * 4 + 6);
  uVar88 = (ulong)(uint)((int)lVar25 << 6);
  auVar101 = *(undefined1 (*) [16])(lVar93 + uVar88);
  if (local_a88 != 0) {
    uVar89 = local_a88 - 1 & local_a88;
    for (uVar97 = local_a88; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    }
    if (uVar89 != 0) {
      for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar21 = *(undefined1 (*) [16])(lVar93 + 0x10 + uVar88);
  auVar102 = *(undefined1 (*) [16])(lVar93 + 0x20 + uVar88);
  auVar103 = *(undefined1 (*) [16])(lVar93 + 0x30 + uVar88);
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x40)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar112 = vinsertps_avx(auVar99,ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x28)
  ;
  local_700 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[4].vx.field_0.m128[(long)ray]));
  local_720 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[5].vy.field_0.m128[(long)ray]));
  auVar99 = vunpcklps_avx512vl(local_700._0_16_,local_720._0_16_);
  _local_740 = vbroadcastss_avx512vl(ZEXT416((uint)pre->ray_space[6].vz.field_0.m128[(long)ray]));
  auVar105 = local_740._0_16_;
  local_990 = vinsertps_avx512f(auVar99,auVar105,0x28);
  auVar108._0_4_ = auVar101._0_4_ + auVar21._0_4_ + auVar102._0_4_ + auVar103._0_4_;
  auVar108._4_4_ = auVar101._4_4_ + auVar21._4_4_ + auVar102._4_4_ + auVar103._4_4_;
  auVar108._8_4_ = auVar101._8_4_ + auVar21._8_4_ + auVar102._8_4_ + auVar103._8_4_;
  auVar108._12_4_ = auVar101._12_4_ + auVar21._12_4_ + auVar102._12_4_ + auVar103._12_4_;
  auVar106._8_4_ = 0x3e800000;
  auVar106._0_8_ = 0x3e8000003e800000;
  auVar106._12_4_ = 0x3e800000;
  auVar99 = vmulps_avx512vl(auVar108,auVar106);
  auVar99 = vsubps_avx(auVar99,auVar112);
  auVar99 = vdpps_avx(auVar99,local_990,0x7f);
  fVar184 = *(float *)((long)&context->scene + 2);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  fVar169 = pre->ray_space[2].vz.field_0.m128[(long)ray];
  auVar109._4_12_ = ZEXT812(0) << 0x20;
  auVar109._0_4_ = local_9a0._0_4_;
  auVar100 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar109);
  auVar104 = vfnmadd213ss_fma(auVar100,local_9a0,ZEXT416(0x40000000));
  local_580 = auVar99._0_4_ * auVar100._0_4_ * auVar104._0_4_;
  auVar107._4_4_ = local_580;
  auVar107._0_4_ = local_580;
  auVar107._8_4_ = local_580;
  auVar107._12_4_ = local_580;
  fStack_950 = local_580;
  _local_960 = auVar107;
  fStack_94c = local_580;
  fStack_948 = local_580;
  fStack_944 = local_580;
  auVar99 = vfmadd231ps_fma(auVar112,local_990,auVar107);
  auVar99 = vblendps_avx(auVar99,ZEXT816(0) << 0x40,8);
  auVar101 = vsubps_avx(auVar101,auVar99);
  auVar102 = vsubps_avx(auVar102,auVar99);
  auVar21 = vsubps_avx(auVar21,auVar99);
  auVar103 = vsubps_avx(auVar103,auVar99);
  uVar187 = auVar101._0_4_;
  local_a20._4_4_ = uVar187;
  local_a20._0_4_ = uVar187;
  local_a20._8_4_ = uVar187;
  local_a20._12_4_ = uVar187;
  local_a20._16_4_ = uVar187;
  local_a20._20_4_ = uVar187;
  local_a20._24_4_ = uVar187;
  local_a20._28_4_ = uVar187;
  auVar268 = ZEXT3264(local_a20);
  auVar138._8_4_ = 1;
  auVar138._0_8_ = 0x100000001;
  auVar138._12_4_ = 1;
  auVar138._16_4_ = 1;
  auVar138._20_4_ = 1;
  auVar138._24_4_ = 1;
  auVar138._28_4_ = 1;
  local_800 = ZEXT1632(auVar101);
  local_a40 = vpermps_avx2(auVar138,local_800);
  auVar273 = ZEXT3264(local_a40);
  auVar139._8_4_ = 2;
  auVar139._0_8_ = 0x200000002;
  auVar139._12_4_ = 2;
  auVar139._16_4_ = 2;
  auVar139._20_4_ = 2;
  auVar139._24_4_ = 2;
  auVar139._28_4_ = 2;
  local_a60 = vpermps_avx2(auVar139,local_800);
  auVar275 = ZEXT3264(local_a60);
  auVar140._8_4_ = 3;
  auVar140._0_8_ = 0x300000003;
  auVar140._12_4_ = 3;
  auVar140._16_4_ = 3;
  auVar140._20_4_ = 3;
  auVar140._24_4_ = 3;
  auVar140._28_4_ = 3;
  local_9c0 = vpermps_avx2(auVar140,local_800);
  uVar187 = auVar21._0_4_;
  local_9e0._4_4_ = uVar187;
  local_9e0._0_4_ = uVar187;
  local_9e0._8_4_ = uVar187;
  local_9e0._12_4_ = uVar187;
  local_9e0._16_4_ = uVar187;
  local_9e0._20_4_ = uVar187;
  local_9e0._24_4_ = uVar187;
  local_9e0._28_4_ = uVar187;
  auVar260 = ZEXT3264(local_9e0);
  local_840 = ZEXT1632(auVar21);
  local_a00 = vpermps_avx2(auVar138,local_840);
  local_a80 = vpermps_avx2(auVar139,local_840);
  auVar278 = ZEXT3264(local_a80);
  auVar118 = vpermps_avx512vl(auVar140,local_840);
  auVar267 = ZEXT3264(local_a00);
  auVar116 = vbroadcastss_avx512vl(auVar102);
  local_820 = ZEXT1632(auVar102);
  auVar119 = vpermps_avx512vl(auVar138,local_820);
  auVar120 = vpermps_avx512vl(auVar139,local_820);
  auVar121 = vpermps_avx512vl(auVar140,local_820);
  auVar265 = ZEXT3264(local_9c0);
  auVar117 = vbroadcastss_avx512vl(auVar103);
  _local_860 = ZEXT1632(auVar103);
  auVar122 = vpermps_avx512vl(auVar138,_local_860);
  auVar123 = vpermps_avx512vl(auVar139,_local_860);
  auVar124 = vpermps_avx512vl(auVar140,_local_860);
  auVar101 = vmulss_avx512f(auVar105,auVar105);
  auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),local_720,local_720);
  auVar125 = vfmadd231ps_avx512vl(auVar125,local_700,local_700);
  auVar125 = vbroadcastss_avx512vl(auVar125._0_16_);
  auVar137._8_4_ = 0x7fffffff;
  auVar137._0_8_ = 0x7fffffff7fffffff;
  auVar137._12_4_ = 0x7fffffff;
  auVar137._16_4_ = 0x7fffffff;
  auVar137._20_4_ = 0x7fffffff;
  auVar137._24_4_ = 0x7fffffff;
  auVar137._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar125,auVar137);
  local_560 = auVar125;
  local_920 = ZEXT416((uint)local_580);
  local_580 = fVar169 - local_580;
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  auVar183 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar183);
  uVar88 = 0;
  auVar183 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar183);
  auVar101 = vsqrtss_avx(local_9a0,local_9a0);
  auVar21 = vsqrtss_avx(local_9a0,local_9a0);
  auVar270 = ZEXT3264(local_a80);
  local_630 = ZEXT816(0x3f80000000000000);
  auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar280 = ZEXT3264(auVar126);
  auVar183 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar102 = vmovshdup_avx(local_630);
    auVar102 = vsubps_avx(auVar102,local_630);
    fVar228 = auVar102._0_4_;
    fVar170 = fVar228 * 0.04761905;
    auVar223._0_4_ = local_630._0_4_;
    auVar223._4_4_ = auVar223._0_4_;
    auVar223._8_4_ = auVar223._0_4_;
    auVar223._12_4_ = auVar223._0_4_;
    auVar223._16_4_ = auVar223._0_4_;
    auVar223._20_4_ = auVar223._0_4_;
    auVar223._24_4_ = auVar223._0_4_;
    auVar223._28_4_ = auVar223._0_4_;
    auVar242._4_4_ = fVar228;
    auVar242._0_4_ = fVar228;
    auVar242._8_4_ = fVar228;
    auVar242._12_4_ = fVar228;
    auVar242._16_4_ = fVar228;
    auVar242._20_4_ = fVar228;
    auVar242._24_4_ = fVar228;
    auVar242._28_4_ = fVar228;
    auVar102 = vfmadd231ps_fma(auVar223,auVar242,auVar183._0_32_);
    auVar279 = auVar280._0_32_;
    auVar126 = vsubps_avx512vl(auVar279,ZEXT1632(auVar102));
    fVar185 = auVar102._0_4_;
    fVar198 = auVar102._4_4_;
    auVar248._4_4_ = auVar260._4_4_ * fVar198;
    auVar248._0_4_ = auVar260._0_4_ * fVar185;
    fVar200 = auVar102._8_4_;
    auVar248._8_4_ = auVar260._8_4_ * fVar200;
    fVar202 = auVar102._12_4_;
    auVar248._12_4_ = auVar260._12_4_ * fVar202;
    auVar248._16_4_ = auVar260._16_4_ * 0.0;
    auVar248._20_4_ = auVar260._20_4_ * 0.0;
    auVar248._24_4_ = auVar260._24_4_ * 0.0;
    auVar248._28_4_ = auVar223._0_4_;
    auVar146._4_4_ = auVar267._4_4_ * fVar198;
    auVar146._0_4_ = auVar267._0_4_ * fVar185;
    auVar146._8_4_ = auVar267._8_4_ * fVar200;
    auVar146._12_4_ = auVar267._12_4_ * fVar202;
    auVar146._16_4_ = auVar267._16_4_ * 0.0;
    auVar146._20_4_ = auVar267._20_4_ * 0.0;
    auVar146._24_4_ = auVar267._24_4_ * 0.0;
    auVar146._28_4_ = fVar228;
    auVar249._0_4_ = auVar270._0_4_ * fVar185;
    auVar249._4_4_ = auVar270._4_4_ * fVar198;
    auVar249._8_4_ = auVar270._8_4_ * fVar200;
    auVar249._12_4_ = auVar270._12_4_ * fVar202;
    auVar249._16_4_ = auVar270._16_4_ * 0.0;
    auVar249._20_4_ = auVar270._20_4_ * 0.0;
    auVar249._28_36_ = auVar183._28_36_;
    auVar249._24_4_ = auVar270._24_4_ * 0.0;
    auVar115 = vmulps_avx512vl(auVar118,ZEXT1632(auVar102));
    auVar103 = vfmadd231ps_fma(auVar248,auVar126,auVar268._0_32_);
    auVar99 = vfmadd231ps_fma(auVar146,auVar126,auVar273._0_32_);
    auVar112 = vfmadd231ps_fma(auVar249._0_32_,auVar126,auVar275._0_32_);
    auVar104 = vfmadd231ps_fma(auVar115,auVar126,auVar265._0_32_);
    auVar115 = vmulps_avx512vl(auVar116,ZEXT1632(auVar102));
    auVar129 = ZEXT1632(auVar102);
    auVar113 = vmulps_avx512vl(auVar119,auVar129);
    auVar114 = vmulps_avx512vl(auVar120,auVar129);
    auVar127 = vmulps_avx512vl(auVar121,auVar129);
    auVar100 = vfmadd231ps_fma(auVar115,auVar126,auVar260._0_32_);
    auVar105 = vfmadd231ps_fma(auVar113,auVar126,auVar267._0_32_);
    auVar106 = vfmadd231ps_fma(auVar114,auVar126,auVar270._0_32_);
    auVar115 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar118);
    auVar113 = vmulps_avx512vl(auVar117,auVar129);
    auVar114 = vmulps_avx512vl(auVar122,auVar129);
    auVar127 = vmulps_avx512vl(auVar123,auVar129);
    auVar128 = vmulps_avx512vl(auVar124,auVar129);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar116);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar126,auVar119);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar120);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar126,auVar121);
    auVar260._28_36_ = auVar278._28_36_;
    auVar260._0_28_ =
         ZEXT1628(CONCAT412(fVar202 * auVar100._12_4_,
                            CONCAT48(fVar200 * auVar100._8_4_,
                                     CONCAT44(fVar198 * auVar100._4_4_,fVar185 * auVar100._0_4_))));
    auVar129 = vmulps_avx512vl(auVar129,ZEXT1632(auVar105));
    auVar130 = vmulps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar106));
    auVar131 = vmulps_avx512vl(ZEXT1632(auVar102),auVar115);
    auVar102 = vfmadd231ps_fma(auVar260._0_32_,auVar126,ZEXT1632(auVar103));
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar126,ZEXT1632(auVar99));
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar126,ZEXT1632(auVar112));
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar126,ZEXT1632(auVar104));
    auVar259._0_4_ = auVar113._0_4_ * fVar185;
    auVar259._4_4_ = auVar113._4_4_ * fVar198;
    auVar259._8_4_ = auVar113._8_4_ * fVar200;
    auVar259._12_4_ = auVar113._12_4_ * fVar202;
    auVar259._16_4_ = auVar113._16_4_ * 0.0;
    auVar259._20_4_ = auVar113._20_4_ * 0.0;
    auVar259._24_4_ = auVar113._24_4_ * 0.0;
    auVar259._28_4_ = 0;
    auVar147._4_4_ = auVar114._4_4_ * fVar198;
    auVar147._0_4_ = auVar114._0_4_ * fVar185;
    auVar147._8_4_ = auVar114._8_4_ * fVar200;
    auVar147._12_4_ = auVar114._12_4_ * fVar202;
    auVar147._16_4_ = auVar114._16_4_ * 0.0;
    auVar147._20_4_ = auVar114._20_4_ * 0.0;
    auVar147._24_4_ = auVar114._24_4_ * 0.0;
    auVar147._28_4_ = auVar113._28_4_;
    auVar148._4_4_ = auVar127._4_4_ * fVar198;
    auVar148._0_4_ = auVar127._0_4_ * fVar185;
    auVar148._8_4_ = auVar127._8_4_ * fVar200;
    auVar148._12_4_ = auVar127._12_4_ * fVar202;
    auVar148._16_4_ = auVar127._16_4_ * 0.0;
    auVar148._20_4_ = auVar127._20_4_ * 0.0;
    auVar148._24_4_ = auVar127._24_4_ * 0.0;
    auVar148._28_4_ = auVar114._28_4_;
    auVar151._4_4_ = auVar128._4_4_ * fVar198;
    auVar151._0_4_ = auVar128._0_4_ * fVar185;
    auVar151._8_4_ = auVar128._8_4_ * fVar200;
    auVar151._12_4_ = auVar128._12_4_ * fVar202;
    auVar151._16_4_ = auVar128._16_4_ * 0.0;
    auVar151._20_4_ = auVar128._20_4_ * 0.0;
    auVar151._24_4_ = auVar128._24_4_ * 0.0;
    auVar151._28_4_ = auVar127._28_4_;
    auVar103 = vfmadd231ps_fma(auVar259,auVar126,ZEXT1632(auVar100));
    auVar99 = vfmadd231ps_fma(auVar147,auVar126,ZEXT1632(auVar105));
    auVar112 = vfmadd231ps_fma(auVar148,auVar126,ZEXT1632(auVar106));
    auVar104 = vfmadd231ps_fma(auVar151,auVar126,auVar115);
    auVar100 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar202 * auVar103._12_4_,
                                                  CONCAT48(fVar200 * auVar103._8_4_,
                                                           CONCAT44(fVar198 * auVar103._4_4_,
                                                                    fVar185 * auVar103._0_4_)))),
                               auVar126,ZEXT1632(auVar102));
    auVar132 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar99._12_4_ * fVar202,
                                             CONCAT48(auVar99._8_4_ * fVar200,
                                                      CONCAT44(auVar99._4_4_ * fVar198,
                                                               auVar99._0_4_ * fVar185)))),auVar126,
                          auVar129);
    auVar133 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar112._12_4_ * fVar202,
                                             CONCAT48(auVar112._8_4_ * fVar200,
                                                      CONCAT44(auVar112._4_4_ * fVar198,
                                                               auVar112._0_4_ * fVar185)))),auVar126
                          ,auVar130);
    auVar115 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar104._12_4_ * fVar202,
                                             CONCAT48(auVar104._8_4_ * fVar200,
                                                      CONCAT44(auVar104._4_4_ * fVar198,
                                                               auVar104._0_4_ * fVar185)))),auVar131
                          ,auVar126);
    auVar126 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar102));
    auVar113 = vsubps_avx512vl(ZEXT1632(auVar99),auVar129);
    auVar114 = vsubps_avx512vl(ZEXT1632(auVar112),auVar130);
    auVar127 = vsubps_avx512vl(ZEXT1632(auVar104),auVar131);
    auVar271._0_4_ = fVar170 * auVar126._0_4_ * 3.0;
    auVar271._4_4_ = fVar170 * auVar126._4_4_ * 3.0;
    auVar271._8_4_ = fVar170 * auVar126._8_4_ * 3.0;
    auVar271._12_4_ = fVar170 * auVar126._12_4_ * 3.0;
    auVar271._16_4_ = fVar170 * auVar126._16_4_ * 3.0;
    auVar271._20_4_ = fVar170 * auVar126._20_4_ * 3.0;
    auVar271._24_4_ = fVar170 * auVar126._24_4_ * 3.0;
    auVar271._28_4_ = 0;
    auVar274._0_4_ = fVar170 * auVar113._0_4_ * 3.0;
    auVar274._4_4_ = fVar170 * auVar113._4_4_ * 3.0;
    auVar274._8_4_ = fVar170 * auVar113._8_4_ * 3.0;
    auVar274._12_4_ = fVar170 * auVar113._12_4_ * 3.0;
    auVar274._16_4_ = fVar170 * auVar113._16_4_ * 3.0;
    auVar274._20_4_ = fVar170 * auVar113._20_4_ * 3.0;
    auVar274._24_4_ = fVar170 * auVar113._24_4_ * 3.0;
    auVar274._28_4_ = 0;
    auVar152._4_4_ = fVar170 * auVar114._4_4_ * 3.0;
    auVar152._0_4_ = fVar170 * auVar114._0_4_ * 3.0;
    auVar152._8_4_ = fVar170 * auVar114._8_4_ * 3.0;
    auVar152._12_4_ = fVar170 * auVar114._12_4_ * 3.0;
    auVar152._16_4_ = fVar170 * auVar114._16_4_ * 3.0;
    auVar152._20_4_ = fVar170 * auVar114._20_4_ * 3.0;
    auVar152._24_4_ = fVar170 * auVar114._24_4_ * 3.0;
    auVar152._28_4_ = auVar128._28_4_;
    fVar185 = auVar127._0_4_ * 3.0 * fVar170;
    fVar198 = auVar127._4_4_ * 3.0 * fVar170;
    auVar42._4_4_ = fVar198;
    auVar42._0_4_ = fVar185;
    fVar200 = auVar127._8_4_ * 3.0 * fVar170;
    auVar42._8_4_ = fVar200;
    fVar202 = auVar127._12_4_ * 3.0 * fVar170;
    auVar42._12_4_ = fVar202;
    fVar228 = auVar127._16_4_ * 3.0 * fVar170;
    auVar42._16_4_ = fVar228;
    fVar205 = auVar127._20_4_ * 3.0 * fVar170;
    auVar42._20_4_ = fVar205;
    fVar207 = auVar127._24_4_ * 3.0 * fVar170;
    auVar42._24_4_ = fVar207;
    auVar42._28_4_ = fVar170;
    auVar102 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar102);
    auVar128 = vpermt2ps_avx512vl(ZEXT1632(auVar100),_DAT_01fb9fc0,ZEXT1632(auVar102));
    auVar129 = vpermt2ps_avx512vl(auVar132,_DAT_01fb9fc0,ZEXT1632(auVar102));
    auVar113 = ZEXT1632(auVar102);
    auVar130 = vpermt2ps_avx512vl(auVar133,_DAT_01fb9fc0,auVar113);
    auVar254._0_4_ = auVar115._0_4_ + fVar185;
    auVar254._4_4_ = auVar115._4_4_ + fVar198;
    auVar254._8_4_ = auVar115._8_4_ + fVar200;
    auVar254._12_4_ = auVar115._12_4_ + fVar202;
    auVar254._16_4_ = auVar115._16_4_ + fVar228;
    auVar254._20_4_ = auVar115._20_4_ + fVar205;
    auVar254._24_4_ = auVar115._24_4_ + fVar207;
    auVar254._28_4_ = auVar115._28_4_ + fVar170;
    auVar126 = vmaxps_avx(auVar115,auVar254);
    auVar131 = vminps_avx512vl(auVar115,auVar254);
    auVar134 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,auVar113);
    auVar135 = vpermt2ps_avx512vl(auVar271,_DAT_01fb9fc0,auVar113);
    auVar136 = vpermt2ps_avx512vl(auVar274,_DAT_01fb9fc0,auVar113);
    auVar146 = ZEXT1632(auVar102);
    auVar137 = vpermt2ps_avx512vl(auVar152,_DAT_01fb9fc0,auVar146);
    auVar115 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar146);
    auVar115 = vsubps_avx(auVar134,auVar115);
    auVar113 = vsubps_avx(auVar128,ZEXT1632(auVar100));
    auVar114 = vsubps_avx(auVar129,auVar132);
    auVar127 = vsubps_avx(auVar130,auVar133);
    auVar138 = vmulps_avx512vl(auVar114,auVar152);
    auVar138 = vfmsub231ps_avx512vl(auVar138,auVar274,auVar127);
    auVar139 = vmulps_avx512vl(auVar127,auVar271);
    auVar139 = vfmsub231ps_avx512vl(auVar139,auVar152,auVar113);
    auVar140 = vmulps_avx512vl(auVar113,auVar274);
    auVar140 = vfmsub231ps_avx512vl(auVar140,auVar271,auVar114);
    auVar140 = vmulps_avx512vl(auVar140,auVar140);
    auVar139 = vfmadd231ps_avx512vl(auVar140,auVar139,auVar139);
    auVar138 = vfmadd231ps_avx512vl(auVar139,auVar138,auVar138);
    auVar139 = vmulps_avx512vl(auVar127,auVar127);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar114,auVar114);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar113,auVar113);
    auVar140 = vrcp14ps_avx512vl(auVar139);
    auVar141 = vfnmadd213ps_avx512vl(auVar140,auVar139,auVar279);
    auVar140 = vfmadd132ps_avx512vl(auVar141,auVar140,auVar140);
    auVar138 = vmulps_avx512vl(auVar138,auVar140);
    auVar141 = vmulps_avx512vl(auVar114,auVar137);
    auVar141 = vfmsub231ps_avx512vl(auVar141,auVar136,auVar127);
    auVar142 = vmulps_avx512vl(auVar127,auVar135);
    auVar142 = vfmsub231ps_avx512vl(auVar142,auVar137,auVar113);
    auVar143 = vmulps_avx512vl(auVar113,auVar136);
    auVar143 = vfmsub231ps_avx512vl(auVar143,auVar135,auVar114);
    auVar143 = vmulps_avx512vl(auVar143,auVar143);
    auVar142 = vfmadd231ps_avx512vl(auVar143,auVar142,auVar142);
    auVar141 = vfmadd231ps_avx512vl(auVar142,auVar141,auVar141);
    auVar140 = vmulps_avx512vl(auVar141,auVar140);
    auVar138 = vmaxps_avx512vl(auVar138,auVar140);
    auVar138 = vsqrtps_avx512vl(auVar138);
    auVar140 = vmaxps_avx512vl(auVar115,auVar134);
    auVar126 = vmaxps_avx512vl(auVar126,auVar140);
    auVar140 = vaddps_avx512vl(auVar138,auVar126);
    auVar126 = vminps_avx(auVar115,auVar134);
    auVar126 = vminps_avx512vl(auVar131,auVar126);
    auVar126 = vsubps_avx512vl(auVar126,auVar138);
    auVar141._8_4_ = 0x3f800002;
    auVar141._0_8_ = 0x3f8000023f800002;
    auVar141._12_4_ = 0x3f800002;
    auVar141._16_4_ = 0x3f800002;
    auVar141._20_4_ = 0x3f800002;
    auVar141._24_4_ = 0x3f800002;
    auVar141._28_4_ = 0x3f800002;
    auVar115 = vmulps_avx512vl(auVar140,auVar141);
    auVar142._8_4_ = 0x3f7ffffc;
    auVar142._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar142._12_4_ = 0x3f7ffffc;
    auVar142._16_4_ = 0x3f7ffffc;
    auVar142._20_4_ = 0x3f7ffffc;
    auVar142._24_4_ = 0x3f7ffffc;
    auVar142._28_4_ = 0x3f7ffffc;
    local_ac0 = vmulps_avx512vl(auVar126,auVar142);
    auVar126 = vmulps_avx512vl(auVar115,auVar115);
    auVar115 = vrsqrt14ps_avx512vl(auVar139);
    auVar143._8_4_ = 0xbf000000;
    auVar143._0_8_ = 0xbf000000bf000000;
    auVar143._12_4_ = 0xbf000000;
    auVar143._16_4_ = 0xbf000000;
    auVar143._20_4_ = 0xbf000000;
    auVar143._24_4_ = 0xbf000000;
    auVar143._28_4_ = 0xbf000000;
    auVar131 = vmulps_avx512vl(auVar139,auVar143);
    fVar185 = auVar115._0_4_;
    fVar198 = auVar115._4_4_;
    fVar200 = auVar115._8_4_;
    fVar202 = auVar115._12_4_;
    fVar170 = auVar115._16_4_;
    fVar228 = auVar115._20_4_;
    fVar205 = auVar115._24_4_;
    auVar43._4_4_ = fVar198 * fVar198 * fVar198 * auVar131._4_4_;
    auVar43._0_4_ = fVar185 * fVar185 * fVar185 * auVar131._0_4_;
    auVar43._8_4_ = fVar200 * fVar200 * fVar200 * auVar131._8_4_;
    auVar43._12_4_ = fVar202 * fVar202 * fVar202 * auVar131._12_4_;
    auVar43._16_4_ = fVar170 * fVar170 * fVar170 * auVar131._16_4_;
    auVar43._20_4_ = fVar228 * fVar228 * fVar228 * auVar131._20_4_;
    auVar43._24_4_ = fVar205 * fVar205 * fVar205 * auVar131._24_4_;
    auVar43._28_4_ = auVar140._28_4_;
    auVar144._8_4_ = 0x3fc00000;
    auVar144._0_8_ = 0x3fc000003fc00000;
    auVar144._12_4_ = 0x3fc00000;
    auVar144._16_4_ = 0x3fc00000;
    auVar144._20_4_ = 0x3fc00000;
    auVar144._24_4_ = 0x3fc00000;
    auVar144._28_4_ = 0x3fc00000;
    auVar115 = vfmadd231ps_avx512vl(auVar43,auVar115,auVar144);
    auVar278 = ZEXT3264(auVar115);
    auVar131 = vmulps_avx512vl(auVar113,auVar115);
    auVar134 = vmulps_avx512vl(auVar114,auVar115);
    auVar138 = vmulps_avx512vl(auVar127,auVar115);
    auVar248 = ZEXT1632(auVar100);
    auVar139 = vsubps_avx512vl(auVar146,auVar248);
    auVar140 = vsubps_avx512vl(auVar146,auVar132);
    auVar141 = vsubps_avx512vl(auVar146,auVar133);
    auVar142 = vmulps_avx512vl(_local_740,auVar141);
    auVar142 = vfmadd231ps_avx512vl(auVar142,local_720,auVar140);
    auVar142 = vfmadd231ps_avx512vl(auVar142,local_700,auVar139);
    auVar143 = vmulps_avx512vl(auVar141,auVar141);
    auVar143 = vfmadd231ps_avx512vl(auVar143,auVar140,auVar140);
    auVar143 = vfmadd231ps_avx512vl(auVar143,auVar139,auVar139);
    auVar144 = vmulps_avx512vl(_local_740,auVar138);
    auVar144 = vfmadd231ps_avx512vl(auVar144,auVar134,local_720);
    auVar144 = vfmadd231ps_avx512vl(auVar144,auVar131,local_700);
    auVar138 = vmulps_avx512vl(auVar141,auVar138);
    auVar134 = vfmadd231ps_avx512vl(auVar138,auVar140,auVar134);
    auVar131 = vfmadd231ps_avx512vl(auVar134,auVar139,auVar131);
    auVar134 = vmulps_avx512vl(auVar144,auVar144);
    auVar138 = vsubps_avx512vl(auVar125,auVar134);
    auVar145 = vmulps_avx512vl(auVar144,auVar131);
    auVar142 = vsubps_avx512vl(auVar142,auVar145);
    auVar142 = vaddps_avx512vl(auVar142,auVar142);
    auVar145 = vmulps_avx512vl(auVar131,auVar131);
    auVar143 = vsubps_avx512vl(auVar143,auVar145);
    auVar126 = vsubps_avx512vl(auVar143,auVar126);
    local_760 = vmulps_avx512vl(auVar142,auVar142);
    auVar145._8_4_ = 0x40800000;
    auVar145._0_8_ = 0x4080000040800000;
    auVar145._12_4_ = 0x40800000;
    auVar145._16_4_ = 0x40800000;
    auVar145._20_4_ = 0x40800000;
    auVar145._24_4_ = 0x40800000;
    auVar145._28_4_ = 0x40800000;
    _local_780 = vmulps_avx512vl(auVar138,auVar145);
    auVar145 = vmulps_avx512vl(_local_780,auVar126);
    auVar145 = vsubps_avx512vl(local_760,auVar145);
    uVar97 = vcmpps_avx512vl(auVar145,auVar146,5);
    bVar84 = (byte)uVar97;
    fVar185 = (float)local_960._0_4_;
    fVar198 = (float)local_960._4_4_;
    fVar200 = fStack_958;
    fVar202 = fStack_954;
    fVar170 = fStack_950;
    fVar228 = fStack_94c;
    fVar205 = fStack_948;
    fVar207 = fStack_944;
    if (bVar84 == 0) {
LAB_019aa415:
      auVar183 = ZEXT3264(_DAT_01f7b040);
      auVar268 = ZEXT3264(local_a20);
      auVar273 = ZEXT3264(local_a40);
      auVar275 = ZEXT3264(local_a60);
      auVar265 = ZEXT3264(local_9c0);
      auVar260 = ZEXT3264(local_9e0);
      auVar267 = ZEXT3264(local_a00);
      auVar270 = ZEXT3264(local_a80);
    }
    else {
      local_8c0._0_32_ = auVar143;
      auVar145 = vsqrtps_avx512vl(auVar145);
      auVar146 = vaddps_avx512vl(auVar138,auVar138);
      local_940 = vrcp14ps_avx512vl(auVar146);
      in_ZMM31 = ZEXT3264(local_940);
      auVar147 = vfnmadd213ps_avx512vl(local_940,auVar146,auVar279);
      auVar147 = vfmadd132ps_avx512vl(auVar147,local_940,local_940);
      auVar279._8_4_ = 0x80000000;
      auVar279._0_8_ = 0x8000000080000000;
      auVar279._12_4_ = 0x80000000;
      auVar279._16_4_ = 0x80000000;
      auVar279._20_4_ = 0x80000000;
      auVar279._24_4_ = 0x80000000;
      auVar279._28_4_ = 0x80000000;
      local_7a0 = vxorps_avx512vl(auVar142,auVar279);
      auVar148 = vsubps_avx512vl(local_7a0,auVar145);
      local_880 = vmulps_avx512vl(auVar148,auVar147);
      auVar145 = vsubps_avx512vl(auVar145,auVar142);
      local_980 = vmulps_avx512vl(auVar145,auVar147);
      auVar145 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar147 = vblendmps_avx512vl(auVar145,local_880);
      auVar149._0_4_ =
           (uint)(bVar84 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar145._0_4_;
      bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar149._4_4_ = (uint)bVar94 * auVar147._4_4_ | (uint)!bVar94 * auVar145._4_4_;
      bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar149._8_4_ = (uint)bVar94 * auVar147._8_4_ | (uint)!bVar94 * auVar145._8_4_;
      bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar149._12_4_ = (uint)bVar94 * auVar147._12_4_ | (uint)!bVar94 * auVar145._12_4_;
      bVar94 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar149._16_4_ = (uint)bVar94 * auVar147._16_4_ | (uint)!bVar94 * auVar145._16_4_;
      bVar94 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar149._20_4_ = (uint)bVar94 * auVar147._20_4_ | (uint)!bVar94 * auVar145._20_4_;
      bVar94 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar149._24_4_ = (uint)bVar94 * auVar147._24_4_ | (uint)!bVar94 * auVar145._24_4_;
      bVar94 = SUB81(uVar97 >> 7,0);
      auVar149._28_4_ = (uint)bVar94 * auVar147._28_4_ | (uint)!bVar94 * auVar145._28_4_;
      auVar145 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar147 = vblendmps_avx512vl(auVar145,local_980);
      auVar150._0_4_ =
           (uint)(bVar84 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar145._0_4_;
      bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar150._4_4_ = (uint)bVar94 * auVar147._4_4_ | (uint)!bVar94 * auVar145._4_4_;
      bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar150._8_4_ = (uint)bVar94 * auVar147._8_4_ | (uint)!bVar94 * auVar145._8_4_;
      bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar150._12_4_ = (uint)bVar94 * auVar147._12_4_ | (uint)!bVar94 * auVar145._12_4_;
      bVar94 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar150._16_4_ = (uint)bVar94 * auVar147._16_4_ | (uint)!bVar94 * auVar145._16_4_;
      bVar94 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar150._20_4_ = (uint)bVar94 * auVar147._20_4_ | (uint)!bVar94 * auVar145._20_4_;
      bVar94 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar150._24_4_ = (uint)bVar94 * auVar147._24_4_ | (uint)!bVar94 * auVar145._24_4_;
      bVar94 = SUB81(uVar97 >> 7,0);
      auVar150._28_4_ = (uint)bVar94 * auVar147._28_4_ | (uint)!bVar94 * auVar145._28_4_;
      auVar145 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar134,auVar145);
      local_7c0 = vmaxps_avx512vl(local_560,auVar145);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      local_7e0 = vmulps_avx512vl(local_7c0,auVar36);
      vandps_avx512vl(auVar138,auVar145);
      uVar89 = vcmpps_avx512vl(local_7e0,local_7e0,1);
      uVar97 = uVar97 & uVar89;
      bVar92 = (byte)uVar97;
      if (bVar92 != 0) {
        uVar89 = vcmpps_avx512vl(auVar126,_DAT_01f7b000,2);
        auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar138 = vblendmps_avx512vl(auVar126,auVar134);
        bVar90 = (byte)uVar89;
        uVar98 = (uint)(bVar90 & 1) * auVar138._0_4_ | (uint)!(bool)(bVar90 & 1) * local_7e0._0_4_;
        bVar94 = (bool)((byte)(uVar89 >> 1) & 1);
        uVar162 = (uint)bVar94 * auVar138._4_4_ | (uint)!bVar94 * local_7e0._4_4_;
        bVar94 = (bool)((byte)(uVar89 >> 2) & 1);
        uVar163 = (uint)bVar94 * auVar138._8_4_ | (uint)!bVar94 * local_7e0._8_4_;
        bVar94 = (bool)((byte)(uVar89 >> 3) & 1);
        uVar164 = (uint)bVar94 * auVar138._12_4_ | (uint)!bVar94 * local_7e0._12_4_;
        bVar94 = (bool)((byte)(uVar89 >> 4) & 1);
        uVar165 = (uint)bVar94 * auVar138._16_4_ | (uint)!bVar94 * local_7e0._16_4_;
        bVar94 = (bool)((byte)(uVar89 >> 5) & 1);
        uVar166 = (uint)bVar94 * auVar138._20_4_ | (uint)!bVar94 * local_7e0._20_4_;
        bVar94 = (bool)((byte)(uVar89 >> 6) & 1);
        uVar167 = (uint)bVar94 * auVar138._24_4_ | (uint)!bVar94 * local_7e0._24_4_;
        bVar94 = SUB81(uVar89 >> 7,0);
        uVar168 = (uint)bVar94 * auVar138._28_4_ | (uint)!bVar94 * local_7e0._28_4_;
        auVar149._0_4_ = (bVar92 & 1) * uVar98 | !(bool)(bVar92 & 1) * auVar149._0_4_;
        bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar149._4_4_ = bVar94 * uVar162 | !bVar94 * auVar149._4_4_;
        bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar149._8_4_ = bVar94 * uVar163 | !bVar94 * auVar149._8_4_;
        bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar149._12_4_ = bVar94 * uVar164 | !bVar94 * auVar149._12_4_;
        bVar94 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar149._16_4_ = bVar94 * uVar165 | !bVar94 * auVar149._16_4_;
        bVar94 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar149._20_4_ = bVar94 * uVar166 | !bVar94 * auVar149._20_4_;
        bVar94 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar149._24_4_ = bVar94 * uVar167 | !bVar94 * auVar149._24_4_;
        bVar94 = SUB81(uVar97 >> 7,0);
        auVar149._28_4_ = bVar94 * uVar168 | !bVar94 * auVar149._28_4_;
        auVar126 = vblendmps_avx512vl(auVar134,auVar126);
        bVar94 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar89 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
        bVar14 = SUB81(uVar89 >> 7,0);
        auVar150._0_4_ =
             (uint)(bVar92 & 1) *
             ((uint)(bVar90 & 1) * auVar126._0_4_ | !(bool)(bVar90 & 1) * uVar98) |
             !(bool)(bVar92 & 1) * auVar150._0_4_;
        bVar8 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar150._4_4_ =
             (uint)bVar8 * ((uint)bVar94 * auVar126._4_4_ | !bVar94 * uVar162) |
             !bVar8 * auVar150._4_4_;
        bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar150._8_4_ =
             (uint)bVar94 * ((uint)bVar9 * auVar126._8_4_ | !bVar9 * uVar163) |
             !bVar94 * auVar150._8_4_;
        bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar150._12_4_ =
             (uint)bVar94 * ((uint)bVar10 * auVar126._12_4_ | !bVar10 * uVar164) |
             !bVar94 * auVar150._12_4_;
        bVar94 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar150._16_4_ =
             (uint)bVar94 * ((uint)bVar11 * auVar126._16_4_ | !bVar11 * uVar165) |
             !bVar94 * auVar150._16_4_;
        bVar94 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar150._20_4_ =
             (uint)bVar94 * ((uint)bVar12 * auVar126._20_4_ | !bVar12 * uVar166) |
             !bVar94 * auVar150._20_4_;
        bVar94 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar150._24_4_ =
             (uint)bVar94 * ((uint)bVar13 * auVar126._24_4_ | !bVar13 * uVar167) |
             !bVar94 * auVar150._24_4_;
        bVar94 = SUB81(uVar97 >> 7,0);
        auVar150._28_4_ =
             (uint)bVar94 * ((uint)bVar14 * auVar126._28_4_ | !bVar14 * uVar168) |
             !bVar94 * auVar150._28_4_;
        bVar84 = (~bVar92 | bVar90) & bVar84;
      }
      if ((bVar84 & 0x7f) == 0) {
        auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar280 = ZEXT3264(auVar126);
        auVar183 = ZEXT3264(_DAT_01f7b040);
        auVar268 = ZEXT3264(local_a20);
        auVar273 = ZEXT3264(local_a40);
        auVar275 = ZEXT3264(local_a60);
        auVar265 = ZEXT3264(local_9c0);
        auVar260 = ZEXT3264(local_9e0);
        auVar267 = ZEXT3264(local_a00);
        auVar270 = ZEXT3264(local_a80);
      }
      else {
        auVar126 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar134 = vxorps_avx512vl(auVar137,auVar126);
        auVar135 = vxorps_avx512vl(auVar135,auVar126);
        uVar98 = *(uint *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
        auVar183 = ZEXT464(uVar98);
        auVar136 = vxorps_avx512vl(auVar136,auVar126);
        auVar102 = vsubss_avx512f(ZEXT416(uVar98),ZEXT416((uint)local_920._0_4_));
        auVar137 = vbroadcastss_avx512vl(auVar102);
        auVar137 = vminps_avx512vl(auVar137,auVar150);
        auVar83._4_4_ = fStack_57c;
        auVar83._0_4_ = local_580;
        auVar83._8_4_ = fStack_578;
        auVar83._12_4_ = fStack_574;
        auVar83._16_4_ = fStack_570;
        auVar83._20_4_ = fStack_56c;
        auVar83._24_4_ = fStack_568;
        auVar83._28_4_ = fStack_564;
        auVar138 = vmaxps_avx512vl(auVar83,auVar149);
        auVar141 = vmulps_avx512vl(auVar141,auVar152);
        auVar140 = vfmadd213ps_avx512vl(auVar140,auVar274,auVar141);
        auVar102 = vfmadd213ps_fma(auVar139,auVar271,auVar140);
        in_ZMM31 = ZEXT3264(_local_740);
        auVar139 = vmulps_avx512vl(_local_740,auVar152);
        auVar139 = vfmadd231ps_avx512vl(auVar139,local_720,auVar274);
        auVar139 = vfmadd231ps_avx512vl(auVar139,local_700,auVar271);
        auVar140 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar139,auVar140);
        auVar141 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar22 = vcmpps_avx512vl(auVar140,auVar141,1);
        auVar145 = vxorps_avx512vl(ZEXT1632(auVar102),auVar126);
        auVar147 = vrcp14ps_avx512vl(auVar139);
        auVar148 = vxorps_avx512vl(auVar139,auVar126);
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar152 = vfnmadd213ps_avx512vl(auVar147,auVar139,auVar151);
        auVar102 = vfmadd132ps_fma(auVar152,auVar147,auVar147);
        fVar186 = auVar102._0_4_ * auVar145._0_4_;
        fVar199 = auVar102._4_4_ * auVar145._4_4_;
        auVar44._4_4_ = fVar199;
        auVar44._0_4_ = fVar186;
        fVar201 = auVar102._8_4_ * auVar145._8_4_;
        auVar44._8_4_ = fVar201;
        fVar203 = auVar102._12_4_ * auVar145._12_4_;
        auVar44._12_4_ = fVar203;
        fVar204 = auVar145._16_4_ * 0.0;
        auVar44._16_4_ = fVar204;
        fVar206 = auVar145._20_4_ * 0.0;
        auVar44._20_4_ = fVar206;
        fVar208 = auVar145._24_4_ * 0.0;
        auVar44._24_4_ = fVar208;
        auVar44._28_4_ = auVar145._28_4_;
        uVar24 = vcmpps_avx512vl(auVar139,auVar148,1);
        bVar92 = (byte)uVar22 | (byte)uVar24;
        auVar276._8_4_ = 0xff800000;
        auVar276._0_8_ = 0xff800000ff800000;
        auVar276._12_4_ = 0xff800000;
        auVar276._16_4_ = 0xff800000;
        auVar276._20_4_ = 0xff800000;
        auVar276._24_4_ = 0xff800000;
        auVar276._28_4_ = 0xff800000;
        auVar152 = vblendmps_avx512vl(auVar44,auVar276);
        auVar153._0_4_ =
             (uint)(bVar92 & 1) * auVar152._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar147._0_4_;
        bVar94 = (bool)(bVar92 >> 1 & 1);
        auVar153._4_4_ = (uint)bVar94 * auVar152._4_4_ | (uint)!bVar94 * auVar147._4_4_;
        bVar94 = (bool)(bVar92 >> 2 & 1);
        auVar153._8_4_ = (uint)bVar94 * auVar152._8_4_ | (uint)!bVar94 * auVar147._8_4_;
        bVar94 = (bool)(bVar92 >> 3 & 1);
        auVar153._12_4_ = (uint)bVar94 * auVar152._12_4_ | (uint)!bVar94 * auVar147._12_4_;
        bVar94 = (bool)(bVar92 >> 4 & 1);
        auVar153._16_4_ = (uint)bVar94 * auVar152._16_4_ | (uint)!bVar94 * auVar147._16_4_;
        bVar94 = (bool)(bVar92 >> 5 & 1);
        auVar153._20_4_ = (uint)bVar94 * auVar152._20_4_ | (uint)!bVar94 * auVar147._20_4_;
        bVar94 = (bool)(bVar92 >> 6 & 1);
        auVar153._24_4_ = (uint)bVar94 * auVar152._24_4_ | (uint)!bVar94 * auVar147._24_4_;
        auVar153._28_4_ =
             (uint)(bVar92 >> 7) * auVar152._28_4_ | (uint)!(bool)(bVar92 >> 7) * auVar147._28_4_;
        auVar138 = vmaxps_avx512vl(auVar138,auVar153);
        uVar24 = vcmpps_avx512vl(auVar139,auVar148,6);
        bVar92 = (byte)uVar22 | (byte)uVar24;
        auVar139 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar154._0_4_ =
             (uint)(bVar92 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar92 & 1) * (int)fVar186;
        bVar94 = (bool)(bVar92 >> 1 & 1);
        auVar154._4_4_ = (uint)bVar94 * auVar139._4_4_ | (uint)!bVar94 * (int)fVar199;
        bVar94 = (bool)(bVar92 >> 2 & 1);
        auVar154._8_4_ = (uint)bVar94 * auVar139._8_4_ | (uint)!bVar94 * (int)fVar201;
        bVar94 = (bool)(bVar92 >> 3 & 1);
        auVar154._12_4_ = (uint)bVar94 * auVar139._12_4_ | (uint)!bVar94 * (int)fVar203;
        bVar94 = (bool)(bVar92 >> 4 & 1);
        auVar154._16_4_ = (uint)bVar94 * auVar139._16_4_ | (uint)!bVar94 * (int)fVar204;
        bVar94 = (bool)(bVar92 >> 5 & 1);
        auVar154._20_4_ = (uint)bVar94 * auVar139._20_4_ | (uint)!bVar94 * (int)fVar206;
        bVar94 = (bool)(bVar92 >> 6 & 1);
        auVar154._24_4_ = (uint)bVar94 * auVar139._24_4_ | (uint)!bVar94 * (int)fVar208;
        auVar154._28_4_ =
             (uint)(bVar92 >> 7) * auVar139._28_4_ | (uint)!(bool)(bVar92 >> 7) * auVar145._28_4_;
        auVar145 = vminps_avx512vl(auVar137,auVar154);
        auVar102 = vxorps_avx512vl(auVar137._0_16_,auVar137._0_16_);
        auVar128 = vsubps_avx512vl(ZEXT1632(auVar102),auVar128);
        auVar129 = vsubps_avx512vl(ZEXT1632(auVar102),auVar129);
        auVar137 = ZEXT1632(auVar102);
        auVar130 = vsubps_avx512vl(auVar137,auVar130);
        auVar130 = vmulps_avx512vl(auVar130,auVar134);
        auVar129 = vfmadd231ps_avx512vl(auVar130,auVar136,auVar129);
        auVar128 = vfmadd231ps_avx512vl(auVar129,auVar135,auVar128);
        auVar129 = vmulps_avx512vl(_local_740,auVar134);
        auVar129 = vfmadd231ps_avx512vl(auVar129,local_720,auVar136);
        auVar129 = vfmadd231ps_avx512vl(auVar129,local_700,auVar135);
        vandps_avx512vl(auVar129,auVar140);
        uVar22 = vcmpps_avx512vl(auVar129,auVar141,1);
        auVar128 = vxorps_avx512vl(auVar128,auVar126);
        auVar130 = vrcp14ps_avx512vl(auVar129);
        auVar126 = vxorps_avx512vl(auVar129,auVar126);
        auVar134 = vfnmadd213ps_avx512vl(auVar130,auVar129,auVar151);
        auVar102 = vfmadd132ps_fma(auVar134,auVar130,auVar130);
        fVar186 = auVar102._0_4_ * auVar128._0_4_;
        fVar199 = auVar102._4_4_ * auVar128._4_4_;
        auVar45._4_4_ = fVar199;
        auVar45._0_4_ = fVar186;
        fVar201 = auVar102._8_4_ * auVar128._8_4_;
        auVar45._8_4_ = fVar201;
        fVar203 = auVar102._12_4_ * auVar128._12_4_;
        auVar45._12_4_ = fVar203;
        fVar204 = auVar128._16_4_ * 0.0;
        auVar45._16_4_ = fVar204;
        fVar206 = auVar128._20_4_ * 0.0;
        auVar45._20_4_ = fVar206;
        fVar208 = auVar128._24_4_ * 0.0;
        auVar45._24_4_ = fVar208;
        auVar45._28_4_ = auVar128._28_4_;
        uVar24 = vcmpps_avx512vl(auVar129,auVar126,1);
        bVar92 = (byte)uVar22 | (byte)uVar24;
        auVar134 = vblendmps_avx512vl(auVar45,auVar276);
        auVar155._0_4_ =
             (uint)(bVar92 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar92 & 1) * auVar130._0_4_;
        bVar94 = (bool)(bVar92 >> 1 & 1);
        auVar155._4_4_ = (uint)bVar94 * auVar134._4_4_ | (uint)!bVar94 * auVar130._4_4_;
        bVar94 = (bool)(bVar92 >> 2 & 1);
        auVar155._8_4_ = (uint)bVar94 * auVar134._8_4_ | (uint)!bVar94 * auVar130._8_4_;
        bVar94 = (bool)(bVar92 >> 3 & 1);
        auVar155._12_4_ = (uint)bVar94 * auVar134._12_4_ | (uint)!bVar94 * auVar130._12_4_;
        bVar94 = (bool)(bVar92 >> 4 & 1);
        auVar155._16_4_ = (uint)bVar94 * auVar134._16_4_ | (uint)!bVar94 * auVar130._16_4_;
        bVar94 = (bool)(bVar92 >> 5 & 1);
        auVar155._20_4_ = (uint)bVar94 * auVar134._20_4_ | (uint)!bVar94 * auVar130._20_4_;
        bVar94 = (bool)(bVar92 >> 6 & 1);
        auVar155._24_4_ = (uint)bVar94 * auVar134._24_4_ | (uint)!bVar94 * auVar130._24_4_;
        auVar155._28_4_ =
             (uint)(bVar92 >> 7) * auVar134._28_4_ | (uint)!(bool)(bVar92 >> 7) * auVar130._28_4_;
        local_6e0 = vmaxps_avx(auVar138,auVar155);
        uVar24 = vcmpps_avx512vl(auVar129,auVar126,6);
        bVar92 = (byte)uVar22 | (byte)uVar24;
        auVar156._0_4_ =
             (uint)(bVar92 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar92 & 1) * (int)fVar186;
        bVar94 = (bool)(bVar92 >> 1 & 1);
        auVar156._4_4_ = (uint)bVar94 * auVar139._4_4_ | (uint)!bVar94 * (int)fVar199;
        bVar94 = (bool)(bVar92 >> 2 & 1);
        auVar156._8_4_ = (uint)bVar94 * auVar139._8_4_ | (uint)!bVar94 * (int)fVar201;
        bVar94 = (bool)(bVar92 >> 3 & 1);
        auVar156._12_4_ = (uint)bVar94 * auVar139._12_4_ | (uint)!bVar94 * (int)fVar203;
        bVar94 = (bool)(bVar92 >> 4 & 1);
        auVar156._16_4_ = (uint)bVar94 * auVar139._16_4_ | (uint)!bVar94 * (int)fVar204;
        bVar94 = (bool)(bVar92 >> 5 & 1);
        auVar156._20_4_ = (uint)bVar94 * auVar139._20_4_ | (uint)!bVar94 * (int)fVar206;
        bVar94 = (bool)(bVar92 >> 6 & 1);
        auVar156._24_4_ = (uint)bVar94 * auVar139._24_4_ | (uint)!bVar94 * (int)fVar208;
        auVar156._28_4_ =
             (uint)(bVar92 >> 7) * auVar139._28_4_ | (uint)!(bool)(bVar92 >> 7) * auVar128._28_4_;
        local_5e0 = vminps_avx(auVar145,auVar156);
        uVar22 = vcmpps_avx512vl(local_6e0,local_5e0,2);
        bVar84 = bVar84 & 0x7f & (byte)uVar22;
        if (bVar84 == 0) {
          auVar280 = ZEXT3264(auVar151);
          goto LAB_019aa415;
        }
        auVar128 = vmaxps_avx512vl(auVar137,local_ac0);
        auVar126 = vfmadd213ps_avx512vl(local_880,auVar144,auVar131);
        fVar186 = auVar115._0_4_;
        fVar199 = auVar115._4_4_;
        auVar46._4_4_ = fVar199 * auVar126._4_4_;
        auVar46._0_4_ = fVar186 * auVar126._0_4_;
        fVar201 = auVar115._8_4_;
        auVar46._8_4_ = fVar201 * auVar126._8_4_;
        fVar203 = auVar115._12_4_;
        auVar46._12_4_ = fVar203 * auVar126._12_4_;
        fVar204 = auVar115._16_4_;
        auVar46._16_4_ = fVar204 * auVar126._16_4_;
        fVar206 = auVar115._20_4_;
        auVar46._20_4_ = fVar206 * auVar126._20_4_;
        fVar208 = auVar115._24_4_;
        auVar46._24_4_ = fVar208 * auVar126._24_4_;
        auVar46._28_4_ = auVar126._28_4_;
        auVar126 = vfmadd213ps_avx512vl(local_980,auVar144,auVar131);
        auVar47._4_4_ = fVar199 * auVar126._4_4_;
        auVar47._0_4_ = fVar186 * auVar126._0_4_;
        auVar47._8_4_ = fVar201 * auVar126._8_4_;
        auVar47._12_4_ = fVar203 * auVar126._12_4_;
        auVar47._16_4_ = fVar204 * auVar126._16_4_;
        auVar47._20_4_ = fVar206 * auVar126._20_4_;
        auVar47._24_4_ = fVar208 * auVar126._24_4_;
        auVar47._28_4_ = auVar126._28_4_;
        auVar126 = vminps_avx512vl(auVar46,auVar151);
        auVar129 = ZEXT832(0) << 0x20;
        auVar126 = vmaxps_avx(auVar126,ZEXT832(0) << 0x20);
        auVar130 = vminps_avx512vl(auVar47,auVar151);
        auVar48._4_4_ = (auVar126._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar126._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar126._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar126._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar126._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar126._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar126._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar126._28_4_ + 7.0;
        local_4e0 = vfmadd213ps_avx512vl(auVar48,auVar242,auVar223);
        auVar126 = vmaxps_avx(auVar130,ZEXT832(0) << 0x20);
        auVar49._4_4_ = (auVar126._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar126._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar126._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar126._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar126._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar126._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar126._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar126._28_4_ + 7.0;
        local_500 = vfmadd213ps_avx512vl(auVar49,auVar242,auVar223);
        auVar50._4_4_ = auVar128._4_4_ * auVar128._4_4_;
        auVar50._0_4_ = auVar128._0_4_ * auVar128._0_4_;
        auVar50._8_4_ = auVar128._8_4_ * auVar128._8_4_;
        auVar50._12_4_ = auVar128._12_4_ * auVar128._12_4_;
        auVar50._16_4_ = auVar128._16_4_ * auVar128._16_4_;
        auVar50._20_4_ = auVar128._20_4_ * auVar128._20_4_;
        auVar50._24_4_ = auVar128._24_4_ * auVar128._24_4_;
        auVar50._28_4_ = auVar128._28_4_;
        auVar126 = vsubps_avx(auVar143,auVar50);
        auVar51._4_4_ = auVar126._4_4_ * (float)local_780._4_4_;
        auVar51._0_4_ = auVar126._0_4_ * (float)local_780._0_4_;
        auVar51._8_4_ = auVar126._8_4_ * fStack_778;
        auVar51._12_4_ = auVar126._12_4_ * fStack_774;
        auVar51._16_4_ = auVar126._16_4_ * fStack_770;
        auVar51._20_4_ = auVar126._20_4_ * fStack_76c;
        auVar51._24_4_ = auVar126._24_4_ * fStack_768;
        auVar51._28_4_ = auVar128._28_4_;
        auVar128 = vsubps_avx(local_760,auVar51);
        uVar22 = vcmpps_avx512vl(auVar128,ZEXT832(0) << 0x20,5);
        bVar92 = (byte)uVar22;
        if (bVar92 == 0) {
          bVar92 = 0;
          auVar115 = ZEXT832(0) << 0x20;
          auVar260 = ZEXT864(0) << 0x20;
          auVar128 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar130 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar269 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar158._8_4_ = 0xff800000;
          auVar158._0_8_ = 0xff800000ff800000;
          auVar158._12_4_ = 0xff800000;
          auVar158._16_4_ = 0xff800000;
          auVar158._20_4_ = 0xff800000;
          auVar158._24_4_ = 0xff800000;
          auVar158._28_4_ = 0xff800000;
        }
        else {
          auVar103 = vxorps_avx512vl(auVar140._0_16_,auVar140._0_16_);
          uVar97 = vcmpps_avx512vl(auVar128,auVar137,5);
          auVar128 = vsqrtps_avx(auVar128);
          auVar129 = vfnmadd213ps_avx512vl(auVar146,local_940,auVar151);
          auVar134 = vfmadd132ps_avx512vl(auVar129,local_940,local_940);
          auVar129 = vsubps_avx(local_7a0,auVar128);
          auVar135 = vmulps_avx512vl(auVar129,auVar134);
          auVar128 = vsubps_avx512vl(auVar128,auVar142);
          auVar134 = vmulps_avx512vl(auVar128,auVar134);
          auVar128 = vfmadd213ps_avx512vl(auVar144,auVar135,auVar131);
          auVar52._4_4_ = fVar199 * auVar128._4_4_;
          auVar52._0_4_ = fVar186 * auVar128._0_4_;
          auVar52._8_4_ = fVar201 * auVar128._8_4_;
          auVar52._12_4_ = fVar203 * auVar128._12_4_;
          auVar52._16_4_ = fVar204 * auVar128._16_4_;
          auVar52._20_4_ = fVar206 * auVar128._20_4_;
          auVar52._24_4_ = fVar208 * auVar128._24_4_;
          auVar52._28_4_ = auVar130._28_4_;
          auVar128 = vmulps_avx512vl(local_700,auVar135);
          auVar129 = vmulps_avx512vl(local_720,auVar135);
          auVar136 = vmulps_avx512vl(_local_740,auVar135);
          auVar130 = vfmadd213ps_avx512vl(auVar113,auVar52,auVar248);
          auVar128 = vsubps_avx512vl(auVar128,auVar130);
          auVar130 = vfmadd213ps_avx512vl(auVar114,auVar52,auVar132);
          auVar130 = vsubps_avx512vl(auVar129,auVar130);
          auVar102 = vfmadd213ps_fma(auVar52,auVar127,auVar133);
          auVar129 = vsubps_avx(auVar136,ZEXT1632(auVar102));
          auVar269 = auVar129._0_28_;
          auVar129 = vfmadd213ps_avx512vl(auVar144,auVar134,auVar131);
          auVar131 = vmulps_avx512vl(auVar115,auVar129);
          auVar278 = ZEXT3264(auVar131);
          auVar115 = vmulps_avx512vl(local_700,auVar134);
          auVar136 = vmulps_avx512vl(local_720,auVar134);
          auVar137 = vmulps_avx512vl(_local_740,auVar134);
          auVar102 = vfmadd213ps_fma(auVar113,auVar131,auVar248);
          auVar129 = vsubps_avx(auVar115,ZEXT1632(auVar102));
          auVar102 = vfmadd213ps_fma(auVar114,auVar131,auVar132);
          auVar115 = vsubps_avx512vl(auVar136,ZEXT1632(auVar102));
          auVar102 = vfmadd213ps_fma(auVar127,auVar131,auVar133);
          auVar113 = vsubps_avx512vl(auVar137,ZEXT1632(auVar102));
          auVar260 = ZEXT3264(auVar113);
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar113 = vblendmps_avx512vl(auVar224,auVar135);
          bVar94 = (bool)((byte)uVar97 & 1);
          auVar157._0_4_ = (uint)bVar94 * auVar113._0_4_ | (uint)!bVar94 * auVar100._0_4_;
          bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar157._4_4_ = (uint)bVar94 * auVar113._4_4_ | (uint)!bVar94 * auVar100._4_4_;
          bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar157._8_4_ = (uint)bVar94 * auVar113._8_4_ | (uint)!bVar94 * auVar100._8_4_;
          bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar157._12_4_ = (uint)bVar94 * auVar113._12_4_ | (uint)!bVar94 * auVar100._12_4_;
          iVar1 = (uint)((byte)(uVar97 >> 4) & 1) * auVar113._16_4_;
          auVar157._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar97 >> 5) & 1) * auVar113._20_4_;
          auVar157._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar97 >> 6) & 1) * auVar113._24_4_;
          auVar157._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar97 >> 7) * auVar113._28_4_;
          auVar157._28_4_ = iVar4;
          auVar225._8_4_ = 0xff800000;
          auVar225._0_8_ = 0xff800000ff800000;
          auVar225._12_4_ = 0xff800000;
          auVar225._16_4_ = 0xff800000;
          auVar225._20_4_ = 0xff800000;
          auVar225._24_4_ = 0xff800000;
          auVar225._28_4_ = 0xff800000;
          auVar113 = vblendmps_avx512vl(auVar225,auVar134);
          bVar94 = (bool)((byte)uVar97 & 1);
          auVar158._0_4_ = (uint)bVar94 * auVar113._0_4_ | (uint)!bVar94 * -0x800000;
          bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar158._4_4_ = (uint)bVar94 * auVar113._4_4_ | (uint)!bVar94 * -0x800000;
          bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar158._8_4_ = (uint)bVar94 * auVar113._8_4_ | (uint)!bVar94 * -0x800000;
          bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar158._12_4_ = (uint)bVar94 * auVar113._12_4_ | (uint)!bVar94 * -0x800000;
          bVar94 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar158._16_4_ = (uint)bVar94 * auVar113._16_4_ | (uint)!bVar94 * -0x800000;
          bVar94 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar158._20_4_ = (uint)bVar94 * auVar113._20_4_ | (uint)!bVar94 * -0x800000;
          bVar94 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar158._24_4_ = (uint)bVar94 * auVar113._24_4_ | (uint)!bVar94 * -0x800000;
          bVar94 = SUB81(uVar97 >> 7,0);
          auVar158._28_4_ = (uint)bVar94 * auVar113._28_4_ | (uint)!bVar94 * -0x800000;
          auVar37._8_4_ = 0x36000000;
          auVar37._0_8_ = 0x3600000036000000;
          auVar37._12_4_ = 0x36000000;
          auVar37._16_4_ = 0x36000000;
          auVar37._20_4_ = 0x36000000;
          auVar37._24_4_ = 0x36000000;
          auVar37._28_4_ = 0x36000000;
          auVar113 = vmulps_avx512vl(local_7c0,auVar37);
          uVar89 = vcmpps_avx512vl(auVar113,local_7e0,0xe);
          uVar97 = uVar97 & uVar89;
          bVar90 = (byte)uVar97;
          if (bVar90 != 0) {
            uVar89 = vcmpps_avx512vl(auVar126,ZEXT1632(auVar103),2);
            auVar266._8_4_ = 0x7f800000;
            auVar266._0_8_ = 0x7f8000007f800000;
            auVar266._12_4_ = 0x7f800000;
            auVar266._16_4_ = 0x7f800000;
            auVar266._20_4_ = 0x7f800000;
            auVar266._24_4_ = 0x7f800000;
            auVar266._28_4_ = 0x7f800000;
            auVar272._8_4_ = 0xff800000;
            auVar272._0_8_ = 0xff800000ff800000;
            auVar272._12_4_ = 0xff800000;
            auVar272._16_4_ = 0xff800000;
            auVar272._20_4_ = 0xff800000;
            auVar272._24_4_ = 0xff800000;
            auVar272._28_4_ = 0xff800000;
            auVar126 = vblendmps_avx512vl(auVar266,auVar272);
            bVar85 = (byte)uVar89;
            uVar98 = (uint)(bVar85 & 1) * auVar126._0_4_ |
                     (uint)!(bool)(bVar85 & 1) * auVar113._0_4_;
            bVar94 = (bool)((byte)(uVar89 >> 1) & 1);
            uVar162 = (uint)bVar94 * auVar126._4_4_ | (uint)!bVar94 * auVar113._4_4_;
            bVar94 = (bool)((byte)(uVar89 >> 2) & 1);
            uVar163 = (uint)bVar94 * auVar126._8_4_ | (uint)!bVar94 * auVar113._8_4_;
            bVar94 = (bool)((byte)(uVar89 >> 3) & 1);
            uVar164 = (uint)bVar94 * auVar126._12_4_ | (uint)!bVar94 * auVar113._12_4_;
            bVar94 = (bool)((byte)(uVar89 >> 4) & 1);
            uVar165 = (uint)bVar94 * auVar126._16_4_ | (uint)!bVar94 * auVar113._16_4_;
            bVar94 = (bool)((byte)(uVar89 >> 5) & 1);
            uVar166 = (uint)bVar94 * auVar126._20_4_ | (uint)!bVar94 * auVar113._20_4_;
            bVar94 = (bool)((byte)(uVar89 >> 6) & 1);
            uVar167 = (uint)bVar94 * auVar126._24_4_ | (uint)!bVar94 * auVar113._24_4_;
            bVar94 = SUB81(uVar89 >> 7,0);
            uVar168 = (uint)bVar94 * auVar126._28_4_ | (uint)!bVar94 * auVar113._28_4_;
            auVar157._0_4_ = (bVar90 & 1) * uVar98 | !(bool)(bVar90 & 1) * auVar157._0_4_;
            bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar157._4_4_ = bVar94 * uVar162 | !bVar94 * auVar157._4_4_;
            bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar157._8_4_ = bVar94 * uVar163 | !bVar94 * auVar157._8_4_;
            bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar157._12_4_ = bVar94 * uVar164 | !bVar94 * auVar157._12_4_;
            bVar94 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar157._16_4_ = bVar94 * uVar165 | (uint)!bVar94 * iVar1;
            bVar94 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar157._20_4_ = bVar94 * uVar166 | (uint)!bVar94 * iVar2;
            bVar94 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar157._24_4_ = bVar94 * uVar167 | (uint)!bVar94 * iVar3;
            bVar94 = SUB81(uVar97 >> 7,0);
            auVar157._28_4_ = bVar94 * uVar168 | (uint)!bVar94 * iVar4;
            auVar126 = vblendmps_avx512vl(auVar272,auVar266);
            bVar94 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar89 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar89 >> 6) & 1);
            bVar14 = SUB81(uVar89 >> 7,0);
            auVar158._0_4_ =
                 (uint)(bVar90 & 1) *
                 ((uint)(bVar85 & 1) * auVar126._0_4_ | !(bool)(bVar85 & 1) * uVar98) |
                 !(bool)(bVar90 & 1) * auVar158._0_4_;
            bVar8 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar158._4_4_ =
                 (uint)bVar8 * ((uint)bVar94 * auVar126._4_4_ | !bVar94 * uVar162) |
                 !bVar8 * auVar158._4_4_;
            bVar94 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar158._8_4_ =
                 (uint)bVar94 * ((uint)bVar9 * auVar126._8_4_ | !bVar9 * uVar163) |
                 !bVar94 * auVar158._8_4_;
            bVar94 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar158._12_4_ =
                 (uint)bVar94 * ((uint)bVar10 * auVar126._12_4_ | !bVar10 * uVar164) |
                 !bVar94 * auVar158._12_4_;
            bVar94 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar158._16_4_ =
                 (uint)bVar94 * ((uint)bVar11 * auVar126._16_4_ | !bVar11 * uVar165) |
                 !bVar94 * auVar158._16_4_;
            bVar94 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar158._20_4_ =
                 (uint)bVar94 * ((uint)bVar12 * auVar126._20_4_ | !bVar12 * uVar166) |
                 !bVar94 * auVar158._20_4_;
            bVar94 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar158._24_4_ =
                 (uint)bVar94 * ((uint)bVar13 * auVar126._24_4_ | !bVar13 * uVar167) |
                 !bVar94 * auVar158._24_4_;
            bVar94 = SUB81(uVar97 >> 7,0);
            auVar158._28_4_ =
                 (uint)bVar94 * ((uint)bVar14 * auVar126._28_4_ | !bVar14 * uVar168) |
                 !bVar94 * auVar158._28_4_;
            bVar92 = (~bVar90 | bVar85) & bVar92;
          }
        }
        auVar265._0_4_ = (float)local_740._0_4_ * auVar260._0_4_;
        auVar265._4_4_ = (float)local_740._4_4_ * auVar260._4_4_;
        auVar265._8_4_ = fStack_738 * auVar260._8_4_;
        auVar265._12_4_ = fStack_734 * auVar260._12_4_;
        auVar265._16_4_ = fStack_730 * auVar260._16_4_;
        auVar265._20_4_ = fStack_72c * auVar260._20_4_;
        auVar265._28_36_ = auVar260._28_36_;
        auVar265._24_4_ = fStack_728 * auVar260._24_4_;
        auVar102 = vfmadd231ps_fma(auVar265._0_32_,local_720,auVar115);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_700,auVar129);
        _local_540 = local_6e0;
        local_520 = vminps_avx(local_5e0,auVar157);
        auVar263._8_4_ = 0x7fffffff;
        auVar263._0_8_ = 0x7fffffff7fffffff;
        auVar263._12_4_ = 0x7fffffff;
        auVar263._16_4_ = 0x7fffffff;
        auVar263._20_4_ = 0x7fffffff;
        auVar263._24_4_ = 0x7fffffff;
        auVar263._28_4_ = 0x7fffffff;
        auVar126 = vandps_avx(ZEXT1632(auVar102),auVar263);
        _local_680 = vmaxps_avx(local_6e0,auVar158);
        auVar264._8_4_ = 0x3e99999a;
        auVar264._0_8_ = 0x3e99999a3e99999a;
        auVar264._12_4_ = 0x3e99999a;
        auVar264._16_4_ = 0x3e99999a;
        auVar264._20_4_ = 0x3e99999a;
        auVar264._24_4_ = 0x3e99999a;
        auVar264._28_4_ = 0x3e99999a;
        uVar22 = vcmpps_avx512vl(auVar126,auVar264,1);
        uVar24 = vcmpps_avx512vl(local_6e0,local_520,2);
        bVar90 = (byte)uVar24 & bVar84;
        uVar23 = vcmpps_avx512vl(_local_680,local_5e0,2);
        if ((bVar84 & ((byte)uVar23 | (byte)uVar24)) == 0) {
          auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar280 = ZEXT3264(auVar126);
          auVar183 = ZEXT3264(_DAT_01f7b040);
          auVar268 = ZEXT3264(local_a20);
          auVar273 = ZEXT3264(local_a40);
          auVar275 = ZEXT3264(local_a60);
          auVar265 = ZEXT3264(local_9c0);
          auVar260 = ZEXT3264(local_9e0);
          auVar267 = ZEXT3264(local_a00);
          auVar270 = ZEXT3264(local_a80);
        }
        else {
          bVar85 = (byte)uVar22 | ~bVar92;
          auVar53._4_4_ = (float)local_740._4_4_ * auVar269._4_4_;
          auVar53._0_4_ = (float)local_740._0_4_ * auVar269._0_4_;
          auVar53._8_4_ = fStack_738 * auVar269._8_4_;
          auVar53._12_4_ = fStack_734 * auVar269._12_4_;
          auVar53._16_4_ = fStack_730 * auVar269._16_4_;
          auVar53._20_4_ = fStack_72c * auVar269._20_4_;
          auVar53._24_4_ = fStack_728 * auVar269._24_4_;
          auVar53._28_4_ = local_680._28_4_;
          auVar102 = vfmadd213ps_fma(auVar130,local_720,auVar53);
          auVar102 = vfmadd213ps_fma(auVar128,local_700,ZEXT1632(auVar102));
          auVar126 = vandps_avx(ZEXT1632(auVar102),auVar263);
          uVar22 = vcmpps_avx512vl(auVar126,auVar264,1);
          bVar92 = (byte)uVar22 | ~bVar92;
          auVar177._8_4_ = 2;
          auVar177._0_8_ = 0x200000002;
          auVar177._12_4_ = 2;
          auVar177._16_4_ = 2;
          auVar177._20_4_ = 2;
          auVar177._24_4_ = 2;
          auVar177._28_4_ = 2;
          auVar38._8_4_ = 3;
          auVar38._0_8_ = 0x300000003;
          auVar38._12_4_ = 3;
          auVar38._16_4_ = 3;
          auVar38._20_4_ = 3;
          auVar38._24_4_ = 3;
          auVar38._28_4_ = 3;
          auVar126 = vpblendmd_avx512vl(auVar177,auVar38);
          local_5c0._0_4_ = (uint)(bVar92 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar92 & 1) * 2;
          bVar94 = (bool)(bVar92 >> 1 & 1);
          local_5c0._4_4_ = (uint)bVar94 * auVar126._4_4_ | (uint)!bVar94 * 2;
          bVar94 = (bool)(bVar92 >> 2 & 1);
          local_5c0._8_4_ = (uint)bVar94 * auVar126._8_4_ | (uint)!bVar94 * 2;
          bVar94 = (bool)(bVar92 >> 3 & 1);
          local_5c0._12_4_ = (uint)bVar94 * auVar126._12_4_ | (uint)!bVar94 * 2;
          bVar94 = (bool)(bVar92 >> 4 & 1);
          local_5c0._16_4_ = (uint)bVar94 * auVar126._16_4_ | (uint)!bVar94 * 2;
          bVar94 = (bool)(bVar92 >> 5 & 1);
          local_5c0._20_4_ = (uint)bVar94 * auVar126._20_4_ | (uint)!bVar94 * 2;
          bVar94 = (bool)(bVar92 >> 6 & 1);
          local_5c0._24_4_ = (uint)bVar94 * auVar126._24_4_ | (uint)!bVar94 * 2;
          local_5c0._28_4_ = (uint)(bVar92 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar92 >> 7) * 2;
          local_620 = vpbroadcastd_avx512vl();
          uVar22 = vpcmpd_avx512vl(local_620,local_5c0,5);
          local_660 = local_6e0._0_4_ + (float)local_960._0_4_;
          fStack_65c = local_6e0._4_4_ + (float)local_960._4_4_;
          fStack_658 = local_6e0._8_4_ + fStack_958;
          fStack_654 = local_6e0._12_4_ + fStack_954;
          fStack_650 = local_6e0._16_4_ + fStack_950;
          fStack_64c = local_6e0._20_4_ + fStack_94c;
          fStack_648 = local_6e0._24_4_ + fStack_948;
          fStack_644 = local_6e0._28_4_ + fStack_944;
          _local_600 = _local_680;
          for (bVar92 = (byte)uVar22 & bVar90; bVar92 != 0;
              bVar92 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar92 & (byte)uVar22) {
            auVar178._8_4_ = 0x7f800000;
            auVar178._0_8_ = 0x7f8000007f800000;
            auVar178._12_4_ = 0x7f800000;
            auVar178._16_4_ = 0x7f800000;
            auVar178._20_4_ = 0x7f800000;
            auVar178._24_4_ = 0x7f800000;
            auVar178._28_4_ = 0x7f800000;
            auVar126 = vblendmps_avx512vl(auVar178,local_6e0);
            auVar159._0_4_ =
                 (uint)(bVar92 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar92 & 1) * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 1 & 1);
            auVar159._4_4_ = (uint)bVar94 * auVar126._4_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 2 & 1);
            auVar159._8_4_ = (uint)bVar94 * auVar126._8_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 3 & 1);
            auVar159._12_4_ = (uint)bVar94 * auVar126._12_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 4 & 1);
            auVar159._16_4_ = (uint)bVar94 * auVar126._16_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 5 & 1);
            auVar159._20_4_ = (uint)bVar94 * auVar126._20_4_ | (uint)!bVar94 * 0x7f800000;
            auVar159._24_4_ =
                 (uint)(bVar92 >> 6) * auVar126._24_4_ | (uint)!(bool)(bVar92 >> 6) * 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar126 = vshufps_avx(auVar159,auVar159,0xb1);
            auVar126 = vminps_avx(auVar159,auVar126);
            auVar115 = vshufpd_avx(auVar126,auVar126,5);
            auVar126 = vminps_avx(auVar126,auVar115);
            auVar115 = vpermpd_avx2(auVar126,0x4e);
            auVar126 = vminps_avx(auVar126,auVar115);
            uVar22 = vcmpps_avx512vl(auVar159,auVar126,0);
            bVar86 = (byte)uVar22 & bVar92;
            bVar87 = bVar92;
            if (bVar86 != 0) {
              bVar87 = bVar86;
            }
            iVar2 = 0;
            for (uVar98 = (uint)bVar87; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar98 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
            fVar185 = auVar21._0_4_;
            auVar102 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            if ((float)local_9a0._0_4_ < 0.0) {
              local_ac0._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
              auVar278 = ZEXT1664(auVar278._0_16_);
              fVar185 = sqrtf((float)local_9a0._0_4_);
              auVar102 = local_ac0._0_16_;
            }
            auVar99 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar103 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar112 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar104 = vminps_avx(auVar99,auVar112);
            auVar99 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar112 = vmaxps_avx(auVar103,auVar99);
            auVar229._8_4_ = 0x7fffffff;
            auVar229._0_8_ = 0x7fffffff7fffffff;
            auVar229._12_4_ = 0x7fffffff;
            auVar103 = vandps_avx(auVar104,auVar229);
            auVar99 = vandps_avx(auVar112,auVar229);
            auVar103 = vmaxps_avx(auVar103,auVar99);
            auVar99 = vmovshdup_avx(auVar103);
            auVar99 = vmaxss_avx(auVar99,auVar103);
            auVar103 = vshufpd_avx(auVar103,auVar103,1);
            auVar103 = vmaxss_avx(auVar103,auVar99);
            fVar198 = auVar103._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar112,auVar112,0xff);
            auVar102 = vinsertps_avx(auVar102,ZEXT416(uVar98),0x10);
            auVar183 = ZEXT1664(auVar102);
            lVar93 = 5;
            do {
              do {
                bVar94 = lVar93 == 0;
                lVar93 = lVar93 + -1;
                if (bVar94) goto LAB_019aaed5;
                uVar187 = auVar183._0_4_;
                auVar171._4_4_ = uVar187;
                auVar171._0_4_ = uVar187;
                auVar171._8_4_ = uVar187;
                auVar171._12_4_ = uVar187;
                auVar103 = vfmadd132ps_fma(auVar171,ZEXT816(0) << 0x40,local_990);
                auVar99 = auVar183._0_16_;
                auVar102 = vmovshdup_avx(auVar99);
                local_880._0_16_ = auVar102;
                fVar205 = 1.0 - auVar102._0_4_;
                auVar102 = vshufps_avx(auVar99,auVar99,0x55);
                fVar200 = auVar102._0_4_;
                auVar209._0_4_ = local_840._0_4_ * fVar200;
                fVar202 = auVar102._4_4_;
                auVar209._4_4_ = local_840._4_4_ * fVar202;
                fVar170 = auVar102._8_4_;
                auVar209._8_4_ = local_840._8_4_ * fVar170;
                fVar228 = auVar102._12_4_;
                auVar209._12_4_ = local_840._12_4_ * fVar228;
                _local_780 = ZEXT416((uint)fVar205);
                auVar230._4_4_ = fVar205;
                auVar230._0_4_ = fVar205;
                auVar230._8_4_ = fVar205;
                auVar230._12_4_ = fVar205;
                auVar102 = vfmadd231ps_fma(auVar209,auVar230,local_800._0_16_);
                auVar244._0_4_ = local_820._0_4_ * fVar200;
                auVar244._4_4_ = local_820._4_4_ * fVar202;
                auVar244._8_4_ = local_820._8_4_ * fVar170;
                auVar244._12_4_ = local_820._12_4_ * fVar228;
                auVar99 = vfmadd231ps_fma(auVar244,auVar230,local_840._0_16_);
                auVar250._0_4_ = fVar200 * (float)local_860._0_4_;
                auVar250._4_4_ = fVar202 * (float)local_860._4_4_;
                auVar250._8_4_ = fVar170 * fStack_858;
                auVar250._12_4_ = fVar228 * fStack_854;
                auVar112 = vfmadd231ps_fma(auVar250,auVar230,local_820._0_16_);
                auVar257._0_4_ = fVar200 * auVar99._0_4_;
                auVar257._4_4_ = fVar202 * auVar99._4_4_;
                auVar257._8_4_ = fVar170 * auVar99._8_4_;
                auVar257._12_4_ = fVar228 * auVar99._12_4_;
                auVar102 = vfmadd231ps_fma(auVar257,auVar230,auVar102);
                auVar210._0_4_ = fVar200 * auVar112._0_4_;
                auVar210._4_4_ = fVar202 * auVar112._4_4_;
                auVar210._8_4_ = fVar170 * auVar112._8_4_;
                auVar210._12_4_ = fVar228 * auVar112._12_4_;
                auVar99 = vfmadd231ps_fma(auVar210,auVar230,auVar99);
                auVar245._0_4_ = fVar200 * auVar99._0_4_;
                auVar245._4_4_ = fVar202 * auVar99._4_4_;
                auVar245._8_4_ = fVar170 * auVar99._8_4_;
                auVar245._12_4_ = fVar228 * auVar99._12_4_;
                auVar112 = vfmadd231ps_fma(auVar245,auVar102,auVar230);
                auVar102 = vsubps_avx(auVar99,auVar102);
                auVar26._8_4_ = 0x40400000;
                auVar26._0_8_ = 0x4040000040400000;
                auVar26._12_4_ = 0x40400000;
                auVar99 = vmulps_avx512vl(auVar102,auVar26);
                local_760._0_16_ = auVar112;
                auVar103 = vsubps_avx(auVar103,auVar112);
                auVar102 = vdpps_avx(auVar103,auVar103,0x7f);
                local_ac0._0_16_ = auVar102;
                local_8c0 = auVar183;
                if (auVar102._0_4_ < 0.0) {
                  auVar268._0_4_ = sqrtf(auVar102._0_4_);
                  auVar268._4_60_ = extraout_var;
                  auVar102 = auVar268._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                }
                local_7a0._0_16_ = vdpps_avx(auVar99,auVar99,0x7f);
                fVar200 = local_7a0._0_4_;
                auVar211._4_12_ = ZEXT812(0) << 0x20;
                auVar211._0_4_ = fVar200;
                local_940._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
                fVar202 = local_940._0_4_;
                local_7c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
                auVar27._8_4_ = 0x80000000;
                auVar27._0_8_ = 0x8000000080000000;
                auVar27._12_4_ = 0x80000000;
                auVar104 = vxorps_avx512vl(local_7a0._0_16_,auVar27);
                auVar112 = vfnmadd213ss_fma(local_7c0._0_16_,local_7a0._0_16_,ZEXT416(0x40000000));
                local_7e0._0_4_ = auVar112._0_4_;
                local_980._0_4_ = auVar102._0_4_;
                if (fVar200 < auVar104._0_4_) {
                  fVar170 = sqrtf(fVar200);
                  auVar102 = ZEXT416((uint)local_980._0_4_);
                }
                else {
                  auVar112 = vsqrtss_avx(local_7a0._0_16_,local_7a0._0_16_);
                  fVar170 = auVar112._0_4_;
                }
                fVar228 = local_940._0_4_;
                fVar200 = fVar202 * 1.5 + fVar200 * -0.5 * fVar228 * fVar228 * fVar228;
                local_940._0_4_ = auVar99._0_4_ * fVar200;
                local_940._4_4_ = auVar99._4_4_ * fVar200;
                local_940._8_4_ = auVar99._8_4_ * fVar200;
                local_940._12_4_ = auVar99._12_4_ * fVar200;
                auVar112 = vdpps_avx(auVar103,local_940._0_16_,0x7f);
                fVar205 = auVar102._0_4_;
                fVar202 = auVar112._0_4_;
                auVar172._0_4_ = fVar202 * fVar202;
                auVar172._4_4_ = auVar112._4_4_ * auVar112._4_4_;
                auVar172._8_4_ = auVar112._8_4_ * auVar112._8_4_;
                auVar172._12_4_ = auVar112._12_4_ * auVar112._12_4_;
                auVar104 = vsubps_avx(local_ac0._0_16_,auVar172);
                fVar228 = auVar104._0_4_;
                auVar188._4_12_ = ZEXT812(0) << 0x20;
                auVar188._0_4_ = fVar228;
                auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                auVar105 = vmulss_avx512f(auVar100,ZEXT416(0x3fc00000));
                auVar106 = vmulss_avx512f(auVar104,ZEXT416(0xbf000000));
                if (fVar228 < 0.0) {
                  local_8d0._0_4_ = fVar170;
                  local_8f0._0_4_ = auVar105._0_4_;
                  local_900._4_4_ = fVar200;
                  local_900._0_4_ = fVar200;
                  fStack_8f8 = fVar200;
                  fStack_8f4 = fVar200;
                  local_8e0 = auVar100;
                  fVar228 = sqrtf(fVar228);
                  auVar106 = ZEXT416(auVar106._0_4_);
                  auVar105 = ZEXT416((uint)local_8f0._0_4_);
                  auVar102 = ZEXT416((uint)local_980._0_4_);
                  auVar100 = local_8e0;
                  fVar200 = (float)local_900._0_4_;
                  fVar207 = (float)local_900._4_4_;
                  fVar186 = fStack_8f8;
                  fVar199 = fStack_8f4;
                  fVar170 = (float)local_8d0._0_4_;
                }
                else {
                  auVar104 = vsqrtss_avx(auVar104,auVar104);
                  fVar228 = auVar104._0_4_;
                  fVar207 = fVar200;
                  fVar186 = fVar200;
                  fVar199 = fVar200;
                }
                auVar278 = ZEXT1664(auVar112);
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,
                                           local_880._0_16_);
                auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,
                                           _local_780);
                fVar201 = auVar104._0_4_ * 6.0;
                fVar203 = local_880._0_4_ * 6.0;
                auVar231._0_4_ = fVar203 * (float)local_860._0_4_;
                auVar231._4_4_ = fVar203 * (float)local_860._4_4_;
                auVar231._8_4_ = fVar203 * fStack_858;
                auVar231._12_4_ = fVar203 * fStack_854;
                auVar212._4_4_ = fVar201;
                auVar212._0_4_ = fVar201;
                auVar212._8_4_ = fVar201;
                auVar212._12_4_ = fVar201;
                auVar104 = vfmadd132ps_fma(auVar212,auVar231,local_820._0_16_);
                fVar201 = auVar108._0_4_ * 6.0;
                auVar189._4_4_ = fVar201;
                auVar189._0_4_ = fVar201;
                auVar189._8_4_ = fVar201;
                auVar189._12_4_ = fVar201;
                auVar104 = vfmadd132ps_fma(auVar189,auVar104,local_840._0_16_);
                fVar201 = local_780._0_4_ * 6.0;
                auVar213._4_4_ = fVar201;
                auVar213._0_4_ = fVar201;
                auVar213._8_4_ = fVar201;
                auVar213._12_4_ = fVar201;
                auVar104 = vfmadd132ps_fma(auVar213,auVar104,local_800._0_16_);
                auVar190._0_4_ = auVar104._0_4_ * (float)local_7a0._0_4_;
                auVar190._4_4_ = auVar104._4_4_ * (float)local_7a0._0_4_;
                auVar190._8_4_ = auVar104._8_4_ * (float)local_7a0._0_4_;
                auVar190._12_4_ = auVar104._12_4_ * (float)local_7a0._0_4_;
                auVar104 = vdpps_avx(auVar99,auVar104,0x7f);
                fVar201 = auVar104._0_4_;
                auVar214._0_4_ = auVar99._0_4_ * fVar201;
                auVar214._4_4_ = auVar99._4_4_ * fVar201;
                auVar214._8_4_ = auVar99._8_4_ * fVar201;
                auVar214._12_4_ = auVar99._12_4_ * fVar201;
                auVar104 = vsubps_avx(auVar190,auVar214);
                fVar201 = (float)local_7e0._0_4_ * (float)local_7c0._0_4_;
                auVar108 = vmaxss_avx(ZEXT416((uint)fVar198),
                                      ZEXT416((uint)(local_8c0._0_4_ * fVar185 * 1.9073486e-06)));
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar107 = vxorps_avx512vl(auVar99,auVar28);
                auVar215._0_4_ = fVar200 * auVar104._0_4_ * fVar201;
                auVar215._4_4_ = fVar207 * auVar104._4_4_ * fVar201;
                auVar215._8_4_ = fVar186 * auVar104._8_4_ * fVar201;
                auVar215._12_4_ = fVar199 * auVar104._12_4_ * fVar201;
                auVar104 = vdpps_avx(auVar107,local_940._0_16_,0x7f);
                auVar109 = vfmadd213ss_fma(auVar102,ZEXT416((uint)fVar198),auVar108);
                auVar102 = vdpps_avx(auVar103,auVar215,0x7f);
                auVar109 = vfmadd213ss_fma(ZEXT416((uint)(fVar205 + 1.0)),
                                           ZEXT416((uint)(fVar198 / fVar170)),auVar109);
                fVar200 = auVar104._0_4_ + auVar102._0_4_;
                auVar102 = vdpps_avx(local_990,local_940._0_16_,0x7f);
                auVar104 = vdpps_avx(auVar103,auVar107,0x7f);
                auVar106 = vmulss_avx512f(auVar106,auVar100);
                auVar100 = vmulss_avx512f(auVar100,auVar100);
                auVar107 = vaddss_avx512f(auVar105,ZEXT416((uint)(auVar106._0_4_ * auVar100._0_4_)))
                ;
                auVar100 = vdpps_avx(auVar103,local_990,0x7f);
                auVar106 = vfnmadd231ss_fma(auVar104,auVar112,ZEXT416((uint)fVar200));
                auVar100 = vfnmadd231ss_fma(auVar100,auVar112,auVar102);
                auVar104 = vpermilps_avx(local_760._0_16_,0xff);
                fVar228 = fVar228 - auVar104._0_4_;
                auVar105 = vshufps_avx(auVar99,auVar99,0xff);
                auVar104 = vfmsub213ss_fma(auVar106,auVar107,auVar105);
                auVar261._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                auVar261._8_4_ = auVar104._8_4_ ^ 0x80000000;
                auVar261._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar100 = ZEXT416((uint)(auVar100._0_4_ * auVar107._0_4_));
                auVar106 = vfmsub231ss_fma(ZEXT416((uint)(auVar102._0_4_ * auVar104._0_4_)),
                                           ZEXT416((uint)fVar200),auVar100);
                auVar104 = vinsertps_avx(auVar261,auVar100,0x1c);
                auVar251._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
                auVar251._8_4_ = auVar102._8_4_ ^ 0x80000000;
                auVar251._12_4_ = auVar102._12_4_ ^ 0x80000000;
                auVar100 = vinsertps_avx(ZEXT416((uint)fVar200),auVar251,0x10);
                auVar232._0_4_ = auVar106._0_4_;
                auVar232._4_4_ = auVar232._0_4_;
                auVar232._8_4_ = auVar232._0_4_;
                auVar232._12_4_ = auVar232._0_4_;
                auVar102 = vdivps_avx(auVar104,auVar232);
                auVar104 = vdivps_avx(auVar100,auVar232);
                auVar233._0_4_ = fVar202 * auVar102._0_4_ + fVar228 * auVar104._0_4_;
                auVar233._4_4_ = fVar202 * auVar102._4_4_ + fVar228 * auVar104._4_4_;
                auVar233._8_4_ = fVar202 * auVar102._8_4_ + fVar228 * auVar104._8_4_;
                auVar233._12_4_ = fVar202 * auVar102._12_4_ + fVar228 * auVar104._12_4_;
                auVar102 = vsubps_avx(local_8c0._0_16_,auVar233);
                auVar183 = ZEXT1664(auVar102);
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar104 = vandps_avx512vl(auVar112,auVar29);
              } while (auVar109._0_4_ <= auVar104._0_4_);
              auVar104 = vfmadd231ss_fma(ZEXT416((uint)(auVar109._0_4_ + auVar108._0_4_)),local_910,
                                         ZEXT416(0x36000000));
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar100 = vandps_avx512vl(ZEXT416((uint)fVar228),auVar30);
            } while (auVar104._0_4_ <= auVar100._0_4_);
            fVar185 = auVar102._0_4_ + (float)local_920._0_4_;
            if ((fVar169 <= fVar185) &&
               (fVar198 = pre->ray_space[9].vy.field_0.m128[(long)ray], fVar185 <= fVar198)) {
              auVar102 = vmovshdup_avx(auVar102);
              fVar200 = auVar102._0_4_;
              if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
                auVar102 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_ac0._0_4_));
                fVar202 = auVar102._0_4_;
                lVar93 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar184 * 8);
                if ((*(uint *)(lVar93 + 0x34) & (uint)pre->ray_space[10].vz.field_0.m128[(long)ray])
                    != 0) {
                  fVar202 = fVar202 * 1.5 + local_ac0._0_4_ * -0.5 * fVar202 * fVar202 * fVar202;
                  auVar234._0_4_ = auVar103._0_4_ * fVar202;
                  auVar234._4_4_ = auVar103._4_4_ * fVar202;
                  auVar234._8_4_ = auVar103._8_4_ * fVar202;
                  auVar234._12_4_ = auVar103._12_4_ * fVar202;
                  auVar104 = vfmadd213ps_fma(auVar105,auVar234,auVar99);
                  auVar102 = vshufps_avx(auVar234,auVar234,0xc9);
                  auVar103 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar235._0_4_ = auVar234._0_4_ * auVar103._0_4_;
                  auVar235._4_4_ = auVar234._4_4_ * auVar103._4_4_;
                  auVar235._8_4_ = auVar234._8_4_ * auVar103._8_4_;
                  auVar235._12_4_ = auVar234._12_4_ * auVar103._12_4_;
                  auVar99 = vfmsub231ps_fma(auVar235,auVar99,auVar102);
                  auVar102 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar103 = vshufps_avx(auVar104,auVar104,0xc9);
                  auVar99 = vshufps_avx(auVar99,auVar99,0xd2);
                  auVar173._0_4_ = auVar104._0_4_ * auVar99._0_4_;
                  auVar173._4_4_ = auVar104._4_4_ * auVar99._4_4_;
                  auVar173._8_4_ = auVar104._8_4_ * auVar99._8_4_;
                  auVar173._12_4_ = auVar104._12_4_ * auVar99._12_4_;
                  auVar102 = vfmsub231ps_fma(auVar173,auVar102,auVar103);
                  if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) &&
                     (*(long *)(lVar93 + 0x40) == 0)) {
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                    fVar185 = (float)vextractps_avx(auVar102,1);
                    pre->ray_space[0xe].vz.field_0.m128[(long)ray] = fVar185;
                    uVar187 = vextractps_avx(auVar102,2);
                    *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x40) = uVar187;
                    pre[1].ray_space[0].vx.field_0.m128[(long)ray] = auVar102._0_4_;
                    pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar200;
                    pre[1].ray_space[2].vz.field_0.m128[(long)ray] = 0.0;
                    pre[1].ray_space[4].vx.field_0.m128[(long)ray] = fVar277;
                    pre[1].ray_space[5].vy.field_0.m128[(long)ray] = fVar184;
                    pre[1].ray_space[6].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                    pre[1].ray_space[8].vx.field_0.m128[(long)ray] =
                         *(float *)(*(long *)(k + 8) + 4);
                  }
                  else {
                    puVar6 = *(uint **)(k + 8);
                    auVar260 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar260,auVar183);
                    local_400 = vpermps_avx512f(auVar260,ZEXT1664(auVar102));
                    auVar183 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar183,ZEXT1664(auVar102));
                    local_380 = vbroadcastss_avx512f(auVar102);
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar183 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar183);
                    auVar126 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                    local_aa0[3] = auVar126;
                    local_aa0[2] = auVar126;
                    local_aa0[1] = auVar126;
                    *local_aa0 = auVar126;
                    local_240 = vbroadcastss_avx512f(ZEXT416(*puVar6));
                    local_200 = vbroadcastss_avx512f(ZEXT416(puVar6[1]));
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                    auVar183 = vmovdqa64_avx512f(local_4c0);
                    local_6c0 = vmovdqa64_avx512f(auVar183);
                    local_af0 = local_6c0;
                    local_ae8 = *(undefined8 *)(lVar93 + 0x18);
                    local_ae0 = *(undefined8 *)(k + 8);
                    local_ad0 = (int *)local_400;
                    local_ac8 = 0x10;
                    local_8c0._0_4_ = fVar198;
                    local_ad8 = pre;
                    if (*(code **)(lVar93 + 0x40) != (code *)0x0) {
                      auVar278 = ZEXT1664(auVar112);
                      (**(code **)(lVar93 + 0x40))(&local_af0);
                      auVar183 = vmovdqa64_avx512f(local_6c0);
                      fVar198 = (float)local_8c0._0_4_;
                    }
                    uVar22 = vptestmd_avx512f(auVar183,auVar183);
                    if ((short)uVar22 != 0) {
                      pcVar7 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                      if ((pcVar7 != (code *)0x0) &&
                         (((**(byte **)(k + 0x10) & 2) != 0 ||
                          ((*(byte *)(lVar93 + 0x3e) & 0x40) != 0)))) {
                        auVar278 = ZEXT1664(auVar278._0_16_);
                        (*pcVar7)(&local_af0);
                        auVar183 = vmovdqa64_avx512f(local_6c0);
                        fVar198 = (float)local_8c0._0_4_;
                      }
                      uVar97 = vptestmd_avx512f(auVar183,auVar183);
                      if ((short)uVar97 != 0) {
                        iVar3 = local_ad0[1];
                        iVar4 = local_ad0[2];
                        iVar1 = local_ad0[3];
                        iVar54 = local_ad0[4];
                        iVar55 = local_ad0[5];
                        iVar56 = local_ad0[6];
                        iVar57 = local_ad0[7];
                        iVar58 = local_ad0[8];
                        iVar59 = local_ad0[9];
                        iVar60 = local_ad0[10];
                        iVar61 = local_ad0[0xb];
                        iVar62 = local_ad0[0xc];
                        iVar63 = local_ad0[0xd];
                        iVar64 = local_ad0[0xe];
                        iVar65 = local_ad0[0xf];
                        pVVar5 = &local_ad8->ray_space[0xe].vz;
                        iVar66 = *(int *)((long)&local_ad8->ray_space[0xe].vz.field_0 + 4);
                        iVar67 = *(int *)((long)&local_ad8->ray_space[0xe].vz.field_0 + 8);
                        iVar68 = *(int *)((long)&local_ad8->ray_space[0xe].vz.field_0 + 0xc);
                        iVar69 = *(int *)&local_ad8->ray_space[0xf].vx.field_0;
                        iVar70 = *(int *)((long)&local_ad8->ray_space[0xf].vx.field_0 + 4);
                        iVar71 = *(int *)((long)&local_ad8->ray_space[0xf].vx.field_0 + 8);
                        iVar72 = *(int *)((long)&local_ad8->ray_space[0xf].vx.field_0 + 0xc);
                        iVar73 = *(int *)&local_ad8->ray_space[0xf].vy.field_0;
                        iVar74 = *(int *)((long)&local_ad8->ray_space[0xf].vy.field_0 + 4);
                        iVar75 = *(int *)((long)&local_ad8->ray_space[0xf].vy.field_0 + 8);
                        iVar76 = *(int *)((long)&local_ad8->ray_space[0xf].vy.field_0 + 0xc);
                        iVar77 = *(int *)&local_ad8->ray_space[0xf].vz.field_0;
                        iVar78 = *(int *)((long)&local_ad8->ray_space[0xf].vz.field_0 + 4);
                        iVar79 = *(int *)((long)&local_ad8->ray_space[0xf].vz.field_0 + 8);
                        iVar80 = *(int *)((long)&local_ad8->ray_space[0xf].vz.field_0 + 0xc);
                        bVar87 = (byte)uVar97;
                        bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                        bVar86 = (byte)(uVar97 >> 8);
                        bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                        bVar20 = SUB81(uVar97 >> 0xf,0);
                        (pVVar5->field_0).m128[0] =
                             (float)((uint)(bVar87 & 1) * *local_ad0 |
                                    (uint)!(bool)(bVar87 & 1) * *(int *)&pVVar5->field_0);
                        local_ad8->ray_space[0xe].vz.field_0.m128[1] =
                             (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                        local_ad8->ray_space[0xe].vz.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                        local_ad8->ray_space[0xe].vz.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                        local_ad8->ray_space[0xf].vx.field_0.m128[0] =
                             (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                        local_ad8->ray_space[0xf].vx.field_0.m128[1] =
                             (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                        local_ad8->ray_space[0xf].vx.field_0.m128[2] =
                             (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                        local_ad8->ray_space[0xf].vx.field_0.m128[3] =
                             (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                        local_ad8->ray_space[0xf].vy.field_0.m128[0] =
                             (float)((uint)(bVar86 & 1) * iVar58 |
                                    (uint)!(bool)(bVar86 & 1) * iVar73);
                        local_ad8->ray_space[0xf].vy.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                        local_ad8->ray_space[0xf].vy.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                        local_ad8->ray_space[0xf].vy.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                        local_ad8->ray_space[0xf].vz.field_0.m128[0] =
                             (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                        local_ad8->ray_space[0xf].vz.field_0.m128[1] =
                             (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                        local_ad8->ray_space[0xf].vz.field_0.m128[2] =
                             (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                        local_ad8->ray_space[0xf].vz.field_0.m128[3] =
                             (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                        iVar3 = local_ad0[0x11];
                        iVar4 = local_ad0[0x12];
                        iVar1 = local_ad0[0x13];
                        iVar54 = local_ad0[0x14];
                        iVar55 = local_ad0[0x15];
                        iVar56 = local_ad0[0x16];
                        iVar57 = local_ad0[0x17];
                        iVar58 = local_ad0[0x18];
                        iVar59 = local_ad0[0x19];
                        iVar60 = local_ad0[0x1a];
                        iVar61 = local_ad0[0x1b];
                        iVar62 = local_ad0[0x1c];
                        iVar63 = local_ad0[0x1d];
                        iVar64 = local_ad0[0x1e];
                        iVar65 = local_ad0[0x1f];
                        iVar66 = local_ad8[1].depth_scale.field_0.i[1];
                        iVar67 = local_ad8[1].depth_scale.field_0.i[2];
                        iVar68 = local_ad8[1].depth_scale.field_0.i[3];
                        iVar69 = local_ad8[1].depth_scale.field_0.i[4];
                        iVar70 = local_ad8[1].depth_scale.field_0.i[5];
                        iVar71 = local_ad8[1].depth_scale.field_0.i[6];
                        iVar72 = local_ad8[1].depth_scale.field_0.i[7];
                        iVar73 = local_ad8[1].depth_scale.field_0.i[8];
                        iVar74 = local_ad8[1].depth_scale.field_0.i[9];
                        iVar75 = local_ad8[1].depth_scale.field_0.i[10];
                        iVar76 = local_ad8[1].depth_scale.field_0.i[0xb];
                        iVar77 = local_ad8[1].depth_scale.field_0.i[0xc];
                        iVar78 = local_ad8[1].depth_scale.field_0.i[0xd];
                        iVar79 = local_ad8[1].depth_scale.field_0.i[0xe];
                        iVar80 = local_ad8[1].depth_scale.field_0.i[0xf];
                        bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                        bVar20 = SUB81(uVar97 >> 0xf,0);
                        local_ad8[1].depth_scale.field_0.i[0] =
                             (uint)(bVar87 & 1) * local_ad0[0x10] |
                             (uint)!(bool)(bVar87 & 1) * local_ad8[1].depth_scale.field_0.i[0];
                        local_ad8[1].depth_scale.field_0.i[1] =
                             (uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66;
                        local_ad8[1].depth_scale.field_0.i[2] =
                             (uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67;
                        local_ad8[1].depth_scale.field_0.i[3] =
                             (uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68;
                        local_ad8[1].depth_scale.field_0.i[4] =
                             (uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69;
                        local_ad8[1].depth_scale.field_0.i[5] =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70;
                        local_ad8[1].depth_scale.field_0.i[6] =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71;
                        local_ad8[1].depth_scale.field_0.i[7] =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72;
                        local_ad8[1].depth_scale.field_0.i[8] =
                             (uint)(bVar86 & 1) * iVar58 | (uint)!(bool)(bVar86 & 1) * iVar73;
                        local_ad8[1].depth_scale.field_0.i[9] =
                             (uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74;
                        local_ad8[1].depth_scale.field_0.i[10] =
                             (uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75;
                        local_ad8[1].depth_scale.field_0.i[0xb] =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76;
                        local_ad8[1].depth_scale.field_0.i[0xc] =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77;
                        local_ad8[1].depth_scale.field_0.i[0xd] =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78;
                        local_ad8[1].depth_scale.field_0.i[0xe] =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79;
                        local_ad8[1].depth_scale.field_0.i[0xf] =
                             (uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80;
                        iVar3 = local_ad0[0x21];
                        iVar4 = local_ad0[0x22];
                        iVar1 = local_ad0[0x23];
                        iVar54 = local_ad0[0x24];
                        iVar55 = local_ad0[0x25];
                        iVar56 = local_ad0[0x26];
                        iVar57 = local_ad0[0x27];
                        iVar58 = local_ad0[0x28];
                        iVar59 = local_ad0[0x29];
                        iVar60 = local_ad0[0x2a];
                        iVar61 = local_ad0[0x2b];
                        iVar62 = local_ad0[0x2c];
                        iVar63 = local_ad0[0x2d];
                        iVar64 = local_ad0[0x2e];
                        iVar65 = local_ad0[0x2f];
                        iVar66 = *(int *)((long)&local_ad8[1].ray_space[0].vx.field_0 + 4);
                        iVar67 = *(int *)((long)&local_ad8[1].ray_space[0].vx.field_0 + 8);
                        iVar68 = *(int *)((long)&local_ad8[1].ray_space[0].vx.field_0 + 0xc);
                        iVar69 = *(int *)&local_ad8[1].ray_space[0].vy.field_0;
                        iVar70 = *(int *)((long)&local_ad8[1].ray_space[0].vy.field_0 + 4);
                        iVar71 = *(int *)((long)&local_ad8[1].ray_space[0].vy.field_0 + 8);
                        iVar72 = *(int *)((long)&local_ad8[1].ray_space[0].vy.field_0 + 0xc);
                        iVar73 = *(int *)&local_ad8[1].ray_space[0].vz.field_0;
                        iVar74 = *(int *)((long)&local_ad8[1].ray_space[0].vz.field_0 + 4);
                        iVar75 = *(int *)((long)&local_ad8[1].ray_space[0].vz.field_0 + 8);
                        iVar76 = *(int *)((long)&local_ad8[1].ray_space[0].vz.field_0 + 0xc);
                        iVar77 = *(int *)&local_ad8[1].ray_space[1].vx.field_0;
                        iVar78 = *(int *)((long)&local_ad8[1].ray_space[1].vx.field_0 + 4);
                        iVar79 = *(int *)((long)&local_ad8[1].ray_space[1].vx.field_0 + 8);
                        iVar80 = *(int *)((long)&local_ad8[1].ray_space[1].vx.field_0 + 0xc);
                        bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                        bVar20 = SUB81(uVar97 >> 0xf,0);
                        local_ad8[1].ray_space[0].vx.field_0.m128[0] =
                             (float)((uint)(bVar87 & 1) * local_ad0[0x20] |
                                    (uint)!(bool)(bVar87 & 1) *
                                    *(int *)&local_ad8[1].ray_space[0].vx.field_0);
                        local_ad8[1].ray_space[0].vx.field_0.m128[1] =
                             (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                        local_ad8[1].ray_space[0].vx.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                        local_ad8[1].ray_space[0].vx.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                        local_ad8[1].ray_space[0].vy.field_0.m128[0] =
                             (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                        local_ad8[1].ray_space[0].vy.field_0.m128[1] =
                             (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                        local_ad8[1].ray_space[0].vy.field_0.m128[2] =
                             (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                        local_ad8[1].ray_space[0].vy.field_0.m128[3] =
                             (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                        local_ad8[1].ray_space[0].vz.field_0.m128[0] =
                             (float)((uint)(bVar86 & 1) * iVar58 |
                                    (uint)!(bool)(bVar86 & 1) * iVar73);
                        local_ad8[1].ray_space[0].vz.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                        local_ad8[1].ray_space[0].vz.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                        local_ad8[1].ray_space[0].vz.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                        local_ad8[1].ray_space[1].vx.field_0.m128[0] =
                             (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                        local_ad8[1].ray_space[1].vx.field_0.m128[1] =
                             (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                        local_ad8[1].ray_space[1].vx.field_0.m128[2] =
                             (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                        local_ad8[1].ray_space[1].vx.field_0.m128[3] =
                             (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                        iVar3 = local_ad0[0x31];
                        iVar4 = local_ad0[0x32];
                        iVar1 = local_ad0[0x33];
                        iVar54 = local_ad0[0x34];
                        iVar55 = local_ad0[0x35];
                        iVar56 = local_ad0[0x36];
                        iVar57 = local_ad0[0x37];
                        iVar58 = local_ad0[0x38];
                        iVar59 = local_ad0[0x39];
                        iVar60 = local_ad0[0x3a];
                        iVar61 = local_ad0[0x3b];
                        iVar62 = local_ad0[0x3c];
                        iVar63 = local_ad0[0x3d];
                        iVar64 = local_ad0[0x3e];
                        iVar65 = local_ad0[0x3f];
                        pVVar5 = &local_ad8[1].ray_space[1].vy;
                        iVar66 = *(int *)((long)&local_ad8[1].ray_space[1].vy.field_0 + 4);
                        iVar67 = *(int *)((long)&local_ad8[1].ray_space[1].vy.field_0 + 8);
                        iVar68 = *(int *)((long)&local_ad8[1].ray_space[1].vy.field_0 + 0xc);
                        iVar69 = *(int *)&local_ad8[1].ray_space[1].vz.field_0;
                        iVar70 = *(int *)((long)&local_ad8[1].ray_space[1].vz.field_0 + 4);
                        iVar71 = *(int *)((long)&local_ad8[1].ray_space[1].vz.field_0 + 8);
                        iVar72 = *(int *)((long)&local_ad8[1].ray_space[1].vz.field_0 + 0xc);
                        iVar73 = *(int *)&local_ad8[1].ray_space[2].vx.field_0;
                        iVar74 = *(int *)((long)&local_ad8[1].ray_space[2].vx.field_0 + 4);
                        iVar75 = *(int *)((long)&local_ad8[1].ray_space[2].vx.field_0 + 8);
                        iVar76 = *(int *)((long)&local_ad8[1].ray_space[2].vx.field_0 + 0xc);
                        iVar77 = *(int *)&local_ad8[1].ray_space[2].vy.field_0;
                        iVar78 = *(int *)((long)&local_ad8[1].ray_space[2].vy.field_0 + 4);
                        iVar79 = *(int *)((long)&local_ad8[1].ray_space[2].vy.field_0 + 8);
                        iVar80 = *(int *)((long)&local_ad8[1].ray_space[2].vy.field_0 + 0xc);
                        bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                        bVar20 = SUB81(uVar97 >> 0xf,0);
                        (pVVar5->field_0).m128[0] =
                             (float)((uint)(bVar87 & 1) * local_ad0[0x30] |
                                    (uint)!(bool)(bVar87 & 1) * *(int *)&pVVar5->field_0);
                        local_ad8[1].ray_space[1].vy.field_0.m128[1] =
                             (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                        local_ad8[1].ray_space[1].vy.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                        local_ad8[1].ray_space[1].vy.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                        local_ad8[1].ray_space[1].vz.field_0.m128[0] =
                             (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                        local_ad8[1].ray_space[1].vz.field_0.m128[1] =
                             (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                        local_ad8[1].ray_space[1].vz.field_0.m128[2] =
                             (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                        local_ad8[1].ray_space[1].vz.field_0.m128[3] =
                             (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                        local_ad8[1].ray_space[2].vx.field_0.m128[0] =
                             (float)((uint)(bVar86 & 1) * iVar58 |
                                    (uint)!(bool)(bVar86 & 1) * iVar73);
                        local_ad8[1].ray_space[2].vx.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                        local_ad8[1].ray_space[2].vx.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                        local_ad8[1].ray_space[2].vx.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                        local_ad8[1].ray_space[2].vy.field_0.m128[0] =
                             (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                        local_ad8[1].ray_space[2].vy.field_0.m128[1] =
                             (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                        local_ad8[1].ray_space[2].vy.field_0.m128[2] =
                             (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                        local_ad8[1].ray_space[2].vy.field_0.m128[3] =
                             (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                        iVar3 = local_ad0[0x41];
                        iVar4 = local_ad0[0x42];
                        iVar1 = local_ad0[0x43];
                        iVar54 = local_ad0[0x44];
                        iVar55 = local_ad0[0x45];
                        iVar56 = local_ad0[0x46];
                        iVar57 = local_ad0[0x47];
                        iVar58 = local_ad0[0x48];
                        iVar59 = local_ad0[0x49];
                        iVar60 = local_ad0[0x4a];
                        iVar61 = local_ad0[0x4b];
                        iVar62 = local_ad0[0x4c];
                        iVar63 = local_ad0[0x4d];
                        iVar64 = local_ad0[0x4e];
                        iVar65 = local_ad0[0x4f];
                        pVVar5 = &local_ad8[1].ray_space[2].vz;
                        iVar66 = *(int *)((long)&local_ad8[1].ray_space[2].vz.field_0 + 4);
                        iVar67 = *(int *)((long)&local_ad8[1].ray_space[2].vz.field_0 + 8);
                        iVar68 = *(int *)((long)&local_ad8[1].ray_space[2].vz.field_0 + 0xc);
                        iVar69 = *(int *)&local_ad8[1].ray_space[3].vx.field_0;
                        iVar70 = *(int *)((long)&local_ad8[1].ray_space[3].vx.field_0 + 4);
                        iVar71 = *(int *)((long)&local_ad8[1].ray_space[3].vx.field_0 + 8);
                        iVar72 = *(int *)((long)&local_ad8[1].ray_space[3].vx.field_0 + 0xc);
                        iVar73 = *(int *)&local_ad8[1].ray_space[3].vy.field_0;
                        iVar74 = *(int *)((long)&local_ad8[1].ray_space[3].vy.field_0 + 4);
                        iVar75 = *(int *)((long)&local_ad8[1].ray_space[3].vy.field_0 + 8);
                        iVar76 = *(int *)((long)&local_ad8[1].ray_space[3].vy.field_0 + 0xc);
                        iVar77 = *(int *)&local_ad8[1].ray_space[3].vz.field_0;
                        iVar78 = *(int *)((long)&local_ad8[1].ray_space[3].vz.field_0 + 4);
                        iVar79 = *(int *)((long)&local_ad8[1].ray_space[3].vz.field_0 + 8);
                        iVar80 = *(int *)((long)&local_ad8[1].ray_space[3].vz.field_0 + 0xc);
                        bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                        bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                        bVar20 = SUB81(uVar97 >> 0xf,0);
                        (pVVar5->field_0).m128[0] =
                             (float)((uint)(bVar87 & 1) * local_ad0[0x40] |
                                    (uint)!(bool)(bVar87 & 1) * *(int *)&pVVar5->field_0);
                        local_ad8[1].ray_space[2].vz.field_0.m128[1] =
                             (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                        local_ad8[1].ray_space[2].vz.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                        local_ad8[1].ray_space[2].vz.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                        local_ad8[1].ray_space[3].vx.field_0.m128[0] =
                             (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                        local_ad8[1].ray_space[3].vx.field_0.m128[1] =
                             (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                        local_ad8[1].ray_space[3].vx.field_0.m128[2] =
                             (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                        local_ad8[1].ray_space[3].vx.field_0.m128[3] =
                             (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                        local_ad8[1].ray_space[3].vy.field_0.m128[0] =
                             (float)((uint)(bVar86 & 1) * iVar58 |
                                    (uint)!(bool)(bVar86 & 1) * iVar73);
                        local_ad8[1].ray_space[3].vy.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                        local_ad8[1].ray_space[3].vy.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                        local_ad8[1].ray_space[3].vy.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                        local_ad8[1].ray_space[3].vz.field_0.m128[0] =
                             (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                        local_ad8[1].ray_space[3].vz.field_0.m128[1] =
                             (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                        local_ad8[1].ray_space[3].vz.field_0.m128[2] =
                             (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                        local_ad8[1].ray_space[3].vz.field_0.m128[3] =
                             (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x50));
                        auVar183 = vmovdqu32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_ad8[1].ray_space + 4) = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x60));
                        auVar183 = vmovdqu32_avx512f(auVar183);
                        *(undefined1 (*) [64])&local_ad8[1].ray_space[5].vy = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x70));
                        auVar183 = vmovdqa32_avx512f(auVar183);
                        *(undefined1 (*) [64])&local_ad8[1].ray_space[6].vz = auVar183;
                        auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x80));
                        auVar183 = vmovdqa32_avx512f(auVar183);
                        *(undefined1 (*) [64])(local_ad8[1].ray_space + 8) = auVar183;
                        goto LAB_019aaed5;
                      }
                    }
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar198;
                  }
                }
              }
            }
LAB_019aaed5:
            uVar187 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
            auVar255._4_4_ = uVar187;
            auVar255._0_4_ = uVar187;
            auVar255._8_4_ = uVar187;
            auVar255._12_4_ = uVar187;
            auVar255._16_4_ = uVar187;
            auVar255._20_4_ = uVar187;
            auVar255._24_4_ = uVar187;
            auVar255._28_4_ = uVar187;
            auVar183 = ZEXT3264(auVar255);
            auVar81._4_4_ = fStack_65c;
            auVar81._0_4_ = local_660;
            auVar81._8_4_ = fStack_658;
            auVar81._12_4_ = fStack_654;
            auVar81._16_4_ = fStack_650;
            auVar81._20_4_ = fStack_64c;
            auVar81._24_4_ = fStack_648;
            auVar81._28_4_ = fStack_644;
            uVar22 = vcmpps_avx512vl(auVar255,auVar81,0xd);
          }
          auVar179._0_4_ = (float)local_960._0_4_ + (float)local_680._0_4_;
          auVar179._4_4_ = (float)local_960._4_4_ + (float)local_680._4_4_;
          auVar179._8_4_ = fStack_958 + fStack_678;
          auVar179._12_4_ = fStack_954 + fStack_674;
          auVar179._16_4_ = fStack_950 + fStack_670;
          auVar179._20_4_ = fStack_94c + fStack_66c;
          auVar179._24_4_ = fStack_948 + fStack_668;
          auVar179._28_4_ = fStack_944 + fStack_664;
          uVar187 = auVar183._0_4_;
          auVar194._4_4_ = uVar187;
          auVar194._0_4_ = uVar187;
          auVar194._8_4_ = uVar187;
          auVar194._12_4_ = uVar187;
          auVar194._16_4_ = uVar187;
          auVar194._20_4_ = uVar187;
          auVar194._24_4_ = uVar187;
          auVar194._28_4_ = uVar187;
          uVar22 = vcmpps_avx512vl(auVar179,auVar194,2);
          auVar180._8_4_ = 2;
          auVar180._0_8_ = 0x200000002;
          auVar180._12_4_ = 2;
          auVar180._16_4_ = 2;
          auVar180._20_4_ = 2;
          auVar180._24_4_ = 2;
          auVar180._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar126 = vpblendmd_avx512vl(auVar180,auVar39);
          local_680._0_4_ = (uint)(bVar85 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar85 & 1) * 2;
          bVar94 = (bool)(bVar85 >> 1 & 1);
          local_680._4_4_ = (uint)bVar94 * auVar126._4_4_ | (uint)!bVar94 * 2;
          bVar94 = (bool)(bVar85 >> 2 & 1);
          fStack_678 = (float)((uint)bVar94 * auVar126._8_4_ | (uint)!bVar94 * 2);
          bVar94 = (bool)(bVar85 >> 3 & 1);
          fStack_674 = (float)((uint)bVar94 * auVar126._12_4_ | (uint)!bVar94 * 2);
          bVar94 = (bool)(bVar85 >> 4 & 1);
          fStack_670 = (float)((uint)bVar94 * auVar126._16_4_ | (uint)!bVar94 * 2);
          bVar94 = (bool)(bVar85 >> 5 & 1);
          fStack_66c = (float)((uint)bVar94 * auVar126._20_4_ | (uint)!bVar94 * 2);
          bVar94 = (bool)(bVar85 >> 6 & 1);
          fStack_668 = (float)((uint)bVar94 * auVar126._24_4_ | (uint)!bVar94 * 2);
          fStack_664 = (float)((uint)(bVar85 >> 7) * auVar126._28_4_ |
                              (uint)!(bool)(bVar85 >> 7) * 2);
          bVar84 = (byte)uVar23 & bVar84 & (byte)uVar22;
          uVar22 = vpcmpd_avx512vl(_local_680,local_620,2);
          local_6e0 = _local_600;
          local_660 = (float)local_960._0_4_ + (float)local_600._0_4_;
          fStack_65c = (float)local_960._4_4_ + (float)local_600._4_4_;
          fStack_658 = fStack_958 + fStack_5f8;
          fStack_654 = fStack_954 + fStack_5f4;
          fStack_650 = fStack_950 + fStack_5f0;
          fStack_64c = fStack_94c + fStack_5ec;
          fStack_648 = fStack_948 + fStack_5e8;
          fStack_644 = fStack_944 + fStack_5e4;
          auVar268 = ZEXT3264(local_a20);
          auVar273 = ZEXT3264(local_a40);
          auVar275 = ZEXT3264(local_a60);
          auVar265 = ZEXT3264(local_9c0);
          auVar260 = ZEXT3264(local_9e0);
          auVar267 = ZEXT3264(local_a00);
          auVar270 = ZEXT3264(local_a80);
          for (bVar92 = (byte)uVar22 & bVar84; bVar92 != 0;
              bVar92 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar92 & (byte)uVar22) {
            auVar181._8_4_ = 0x7f800000;
            auVar181._0_8_ = 0x7f8000007f800000;
            auVar181._12_4_ = 0x7f800000;
            auVar181._16_4_ = 0x7f800000;
            auVar181._20_4_ = 0x7f800000;
            auVar181._24_4_ = 0x7f800000;
            auVar181._28_4_ = 0x7f800000;
            auVar126 = vblendmps_avx512vl(auVar181,local_6e0);
            auVar160._0_4_ =
                 (uint)(bVar92 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar92 & 1) * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 1 & 1);
            auVar160._4_4_ = (uint)bVar94 * auVar126._4_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 2 & 1);
            auVar160._8_4_ = (uint)bVar94 * auVar126._8_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 3 & 1);
            auVar160._12_4_ = (uint)bVar94 * auVar126._12_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 4 & 1);
            auVar160._16_4_ = (uint)bVar94 * auVar126._16_4_ | (uint)!bVar94 * 0x7f800000;
            bVar94 = (bool)(bVar92 >> 5 & 1);
            auVar160._20_4_ = (uint)bVar94 * auVar126._20_4_ | (uint)!bVar94 * 0x7f800000;
            auVar160._24_4_ =
                 (uint)(bVar92 >> 6) * auVar126._24_4_ | (uint)!(bool)(bVar92 >> 6) * 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar126 = vshufps_avx(auVar160,auVar160,0xb1);
            auVar126 = vminps_avx(auVar160,auVar126);
            auVar115 = vshufpd_avx(auVar126,auVar126,5);
            auVar126 = vminps_avx(auVar126,auVar115);
            auVar115 = vpermpd_avx2(auVar126,0x4e);
            auVar126 = vminps_avx(auVar126,auVar115);
            uVar22 = vcmpps_avx512vl(auVar160,auVar126,0);
            bVar87 = (byte)uVar22 & bVar92;
            bVar85 = bVar92;
            if (bVar87 != 0) {
              bVar85 = bVar87;
            }
            iVar2 = 0;
            for (uVar98 = (uint)bVar85; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar98 = *(uint *)(local_500 + (uint)(iVar2 << 2));
            fVar185 = auVar101._0_4_;
            auVar102 = ZEXT416(*(uint *)(local_5e0 + (uint)(iVar2 << 2)));
            if ((float)local_9a0._0_4_ < 0.0) {
              local_ac0._0_16_ = ZEXT416(*(uint *)(local_5e0 + (uint)(iVar2 << 2)));
              auVar278 = ZEXT1664(auVar278._0_16_);
              fVar185 = sqrtf((float)local_9a0._0_4_);
              auVar270 = ZEXT3264(local_a80);
              auVar267 = ZEXT3264(local_a00);
              auVar260 = ZEXT3264(local_9e0);
              auVar265 = ZEXT3264(local_9c0);
              auVar275 = ZEXT3264(local_a60);
              auVar273 = ZEXT3264(local_a40);
              auVar268 = ZEXT3264(local_a20);
              auVar102 = local_ac0._0_16_;
            }
            auVar99 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar103 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar112 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar104 = vminps_avx(auVar99,auVar112);
            auVar99 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar112 = vmaxps_avx(auVar103,auVar99);
            auVar111._8_4_ = 0x7fffffff;
            auVar111._0_8_ = 0x7fffffff7fffffff;
            auVar111._12_4_ = 0x7fffffff;
            auVar103 = vandps_avx(auVar104,auVar111);
            auVar99 = vandps_avx(auVar112,auVar111);
            auVar103 = vmaxps_avx(auVar103,auVar99);
            auVar99 = vmovshdup_avx(auVar103);
            auVar99 = vmaxss_avx(auVar99,auVar103);
            auVar103 = vshufpd_avx(auVar103,auVar103,1);
            auVar103 = vmaxss_avx(auVar103,auVar99);
            fVar198 = auVar103._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar112,auVar112,0xff);
            auVar102 = vinsertps_avx(auVar102,ZEXT416(uVar98),0x10);
            auVar183 = ZEXT1664(auVar102);
            lVar93 = 5;
            do {
              do {
                bVar94 = lVar93 == 0;
                lVar93 = lVar93 + -1;
                if (bVar94) goto LAB_019abb9c;
                uVar187 = auVar183._0_4_;
                auVar174._4_4_ = uVar187;
                auVar174._0_4_ = uVar187;
                auVar174._8_4_ = uVar187;
                auVar174._12_4_ = uVar187;
                auVar103 = vfmadd132ps_fma(auVar174,ZEXT816(0) << 0x40,local_990);
                auVar99 = auVar183._0_16_;
                auVar102 = vmovshdup_avx(auVar99);
                local_7a0._0_16_ = auVar102;
                fVar205 = 1.0 - auVar102._0_4_;
                auVar102 = vshufps_avx(auVar99,auVar99,0x55);
                fVar200 = auVar102._0_4_;
                auVar216._0_4_ = local_840._0_4_ * fVar200;
                fVar202 = auVar102._4_4_;
                auVar216._4_4_ = local_840._4_4_ * fVar202;
                fVar170 = auVar102._8_4_;
                auVar216._8_4_ = local_840._8_4_ * fVar170;
                fVar228 = auVar102._12_4_;
                auVar216._12_4_ = local_840._12_4_ * fVar228;
                _local_780 = ZEXT416((uint)fVar205);
                auVar236._4_4_ = fVar205;
                auVar236._0_4_ = fVar205;
                auVar236._8_4_ = fVar205;
                auVar236._12_4_ = fVar205;
                auVar102 = vfmadd231ps_fma(auVar216,auVar236,local_800._0_16_);
                auVar246._0_4_ = local_820._0_4_ * fVar200;
                auVar246._4_4_ = local_820._4_4_ * fVar202;
                auVar246._8_4_ = local_820._8_4_ * fVar170;
                auVar246._12_4_ = local_820._12_4_ * fVar228;
                auVar99 = vfmadd231ps_fma(auVar246,auVar236,local_840._0_16_);
                auVar252._0_4_ = fVar200 * (float)local_860._0_4_;
                auVar252._4_4_ = fVar202 * (float)local_860._4_4_;
                auVar252._8_4_ = fVar170 * fStack_858;
                auVar252._12_4_ = fVar228 * fStack_854;
                auVar112 = vfmadd231ps_fma(auVar252,auVar236,local_820._0_16_);
                auVar258._0_4_ = fVar200 * auVar99._0_4_;
                auVar258._4_4_ = fVar202 * auVar99._4_4_;
                auVar258._8_4_ = fVar170 * auVar99._8_4_;
                auVar258._12_4_ = fVar228 * auVar99._12_4_;
                auVar102 = vfmadd231ps_fma(auVar258,auVar236,auVar102);
                auVar217._0_4_ = fVar200 * auVar112._0_4_;
                auVar217._4_4_ = fVar202 * auVar112._4_4_;
                auVar217._8_4_ = fVar170 * auVar112._8_4_;
                auVar217._12_4_ = fVar228 * auVar112._12_4_;
                auVar99 = vfmadd231ps_fma(auVar217,auVar236,auVar99);
                auVar247._0_4_ = fVar200 * auVar99._0_4_;
                auVar247._4_4_ = fVar202 * auVar99._4_4_;
                auVar247._8_4_ = fVar170 * auVar99._8_4_;
                auVar247._12_4_ = fVar228 * auVar99._12_4_;
                auVar112 = vfmadd231ps_fma(auVar247,auVar102,auVar236);
                auVar102 = vsubps_avx(auVar99,auVar102);
                auVar31._8_4_ = 0x40400000;
                auVar31._0_8_ = 0x4040000040400000;
                auVar31._12_4_ = 0x40400000;
                auVar99 = vmulps_avx512vl(auVar102,auVar31);
                local_760._0_16_ = auVar112;
                auVar103 = vsubps_avx(auVar103,auVar112);
                auVar102 = vdpps_avx(auVar103,auVar103,0x7f);
                local_ac0._0_16_ = auVar102;
                local_8c0 = auVar183;
                if (auVar102._0_4_ < 0.0) {
                  auVar267._0_4_ = sqrtf(auVar102._0_4_);
                  auVar267._4_60_ = extraout_var_00;
                  auVar102 = auVar267._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                }
                local_7c0._0_16_ = vdpps_avx(auVar99,auVar99,0x7f);
                fVar200 = local_7c0._0_4_;
                auVar218._4_12_ = ZEXT812(0) << 0x20;
                auVar218._0_4_ = fVar200;
                local_980._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar218);
                fVar202 = local_980._0_4_;
                local_7e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar218);
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar104 = vxorps_avx512vl(local_7c0._0_16_,auVar32);
                auVar112 = vfnmadd213ss_fma(local_7e0._0_16_,local_7c0._0_16_,ZEXT416(0x40000000));
                local_940._0_4_ = auVar112._0_4_;
                local_880._0_4_ = auVar102._0_4_;
                if (fVar200 < auVar104._0_4_) {
                  fVar170 = sqrtf(fVar200);
                  auVar102 = ZEXT416((uint)local_880._0_4_);
                }
                else {
                  auVar112 = vsqrtss_avx(local_7c0._0_16_,local_7c0._0_16_);
                  fVar170 = auVar112._0_4_;
                }
                fVar228 = local_980._0_4_;
                auVar100 = vbroadcastss_avx512vl
                                     (ZEXT416((uint)(fVar202 * 1.5 +
                                                    fVar200 * -0.5 * fVar228 * fVar228 * fVar228)));
                auVar104 = vmulps_avx512vl(auVar99,auVar100);
                local_980._0_16_ = vdpps_avx(auVar104,auVar103,0x7f);
                auVar106 = vaddss_avx512f(auVar102,ZEXT416(0x3f800000));
                auVar175._0_4_ = local_980._0_4_ * local_980._0_4_;
                auVar175._4_4_ = local_980._4_4_ * local_980._4_4_;
                auVar175._8_4_ = local_980._8_4_ * local_980._8_4_;
                auVar175._12_4_ = local_980._12_4_ * local_980._12_4_;
                auVar112 = vsubps_avx(local_ac0._0_16_,auVar175);
                fVar200 = auVar112._0_4_;
                auVar191._4_12_ = ZEXT812(0) << 0x20;
                auVar191._0_4_ = fVar200;
                auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
                auVar108 = vmulss_avx512f(auVar105,ZEXT416(0x3fc00000));
                auVar109 = vmulss_avx512f(auVar112,ZEXT416(0xbf000000));
                uVar96 = fVar200 == 0.0;
                uVar95 = fVar200 < 0.0;
                if ((bool)uVar95) {
                  local_8e0._0_4_ = auVar108._0_4_;
                  _local_900 = auVar100;
                  local_8f0 = auVar104;
                  local_8d0 = auVar105;
                  fVar200 = sqrtf(fVar200);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar108 = ZEXT416((uint)local_8e0._0_4_);
                  auVar102 = ZEXT416((uint)local_880._0_4_);
                  auVar106 = ZEXT416(auVar106._0_4_);
                  auVar104 = local_8f0;
                  auVar105 = local_8d0;
                  auVar100 = _local_900;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar112,auVar112);
                  fVar200 = auVar112._0_4_;
                }
                auVar278 = ZEXT1664(auVar99);
                auVar268 = ZEXT3264(local_a20);
                auVar273 = ZEXT3264(local_a40);
                auVar275 = ZEXT3264(local_a60);
                auVar270 = ZEXT3264(local_a80);
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,
                                           local_7a0._0_16_);
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                           _local_780);
                fVar202 = auVar112._0_4_ * 6.0;
                fVar228 = local_7a0._0_4_ * 6.0;
                auVar237._0_4_ = fVar228 * (float)local_860._0_4_;
                auVar237._4_4_ = fVar228 * (float)local_860._4_4_;
                auVar237._8_4_ = fVar228 * fStack_858;
                auVar237._12_4_ = fVar228 * fStack_854;
                auVar219._4_4_ = fVar202;
                auVar219._0_4_ = fVar202;
                auVar219._8_4_ = fVar202;
                auVar219._12_4_ = fVar202;
                auVar112 = vfmadd132ps_fma(auVar219,auVar237,local_820._0_16_);
                fVar202 = auVar107._0_4_ * 6.0;
                auVar192._4_4_ = fVar202;
                auVar192._0_4_ = fVar202;
                auVar192._8_4_ = fVar202;
                auVar192._12_4_ = fVar202;
                auVar112 = vfmadd132ps_fma(auVar192,auVar112,local_840._0_16_);
                fVar202 = local_780._0_4_ * 6.0;
                auVar220._4_4_ = fVar202;
                auVar220._0_4_ = fVar202;
                auVar220._8_4_ = fVar202;
                auVar220._12_4_ = fVar202;
                auVar112 = vfmadd132ps_fma(auVar220,auVar112,local_800._0_16_);
                auVar193._0_4_ = auVar112._0_4_ * (float)local_7c0._0_4_;
                auVar193._4_4_ = auVar112._4_4_ * (float)local_7c0._0_4_;
                auVar193._8_4_ = auVar112._8_4_ * (float)local_7c0._0_4_;
                auVar193._12_4_ = auVar112._12_4_ * (float)local_7c0._0_4_;
                auVar112 = vdpps_avx(auVar99,auVar112,0x7f);
                fVar202 = auVar112._0_4_;
                auVar221._0_4_ = auVar99._0_4_ * fVar202;
                auVar221._4_4_ = auVar99._4_4_ * fVar202;
                auVar221._8_4_ = auVar99._8_4_ * fVar202;
                auVar221._12_4_ = auVar99._12_4_ * fVar202;
                auVar112 = vsubps_avx(auVar193,auVar221);
                fVar202 = (float)local_940._0_4_ * (float)local_7e0._0_4_;
                auVar107 = vmaxss_avx(ZEXT416((uint)fVar198),
                                      ZEXT416((uint)(local_8c0._0_4_ * fVar185 * 1.9073486e-06)));
                auVar222._0_4_ = auVar112._0_4_ * fVar202;
                auVar222._4_4_ = auVar112._4_4_ * fVar202;
                auVar222._8_4_ = auVar112._8_4_ * fVar202;
                auVar222._12_4_ = auVar112._12_4_ * fVar202;
                auVar33._8_4_ = 0x80000000;
                auVar33._0_8_ = 0x8000000080000000;
                auVar33._12_4_ = 0x80000000;
                auVar110 = vxorps_avx512vl(auVar99,auVar33);
                auVar111 = vmulps_avx512vl(auVar100,auVar222);
                auVar112 = vdpps_avx(auVar110,auVar104,0x7f);
                auVar100 = vfmadd213ss_fma(auVar102,ZEXT416((uint)fVar198),auVar107);
                auVar102 = vdpps_avx(auVar103,auVar111,0x7f);
                vfmadd213ss_avx512f(auVar106,ZEXT416((uint)(fVar198 / fVar170)),auVar100);
                fVar202 = auVar112._0_4_ + auVar102._0_4_;
                auVar102 = vdpps_avx(local_990,auVar104,0x7f);
                auVar112 = vdpps_avx(auVar103,auVar110,0x7f);
                auVar104 = vmulss_avx512f(auVar109,auVar105);
                auVar100 = vmulss_avx512f(auVar105,auVar105);
                auVar105 = vaddss_avx512f(auVar108,ZEXT416((uint)(auVar104._0_4_ * auVar100._0_4_)))
                ;
                auVar104 = vdpps_avx(auVar103,local_990,0x7f);
                auVar106 = vfnmadd231ss_avx512f(auVar112,local_980._0_16_,ZEXT416((uint)fVar202));
                auVar104 = vfnmadd231ss_avx512f(auVar104,local_980._0_16_,auVar102);
                auVar112 = vpermilps_avx(local_760._0_16_,0xff);
                fVar200 = fVar200 - auVar112._0_4_;
                auVar100 = vshufps_avx(auVar99,auVar99,0xff);
                auVar112 = vfmsub213ss_fma(auVar106,auVar105,auVar100);
                auVar262._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
                auVar262._8_4_ = auVar112._8_4_ ^ 0x80000000;
                auVar262._12_4_ = auVar112._12_4_ ^ 0x80000000;
                auVar104 = ZEXT416((uint)(auVar104._0_4_ * auVar105._0_4_));
                auVar105 = vfmsub231ss_fma(ZEXT416((uint)(auVar102._0_4_ * auVar112._0_4_)),
                                           ZEXT416((uint)fVar202),auVar104);
                auVar112 = vinsertps_avx(auVar262,auVar104,0x1c);
                auVar253._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
                auVar253._8_4_ = auVar102._8_4_ ^ 0x80000000;
                auVar253._12_4_ = auVar102._12_4_ ^ 0x80000000;
                auVar104 = vinsertps_avx(ZEXT416((uint)fVar202),auVar253,0x10);
                auVar238._0_4_ = auVar105._0_4_;
                auVar238._4_4_ = auVar238._0_4_;
                auVar238._8_4_ = auVar238._0_4_;
                auVar238._12_4_ = auVar238._0_4_;
                auVar102 = vdivps_avx(auVar112,auVar238);
                auVar112 = vdivps_avx(auVar104,auVar238);
                auVar104 = vbroadcastss_avx512vl(local_980._0_16_);
                auVar239._0_4_ = auVar104._0_4_ * auVar102._0_4_ + fVar200 * auVar112._0_4_;
                auVar239._4_4_ = auVar104._4_4_ * auVar102._4_4_ + fVar200 * auVar112._4_4_;
                auVar239._8_4_ = auVar104._8_4_ * auVar102._8_4_ + fVar200 * auVar112._8_4_;
                auVar239._12_4_ = auVar104._12_4_ * auVar102._12_4_ + fVar200 * auVar112._12_4_;
                auVar102 = vsubps_avx(local_8c0._0_16_,auVar239);
                auVar183 = ZEXT1664(auVar102);
                auVar34._8_4_ = 0x7fffffff;
                auVar34._0_8_ = 0x7fffffff7fffffff;
                auVar34._12_4_ = 0x7fffffff;
                auVar112 = vandps_avx512vl(local_980._0_16_,auVar34);
                auVar112 = vucomiss_avx512f(auVar112);
                auVar265 = ZEXT3264(local_9c0);
                auVar260 = ZEXT3264(local_9e0);
                auVar267 = ZEXT3264(local_a00);
              } while ((bool)uVar95 || (bool)uVar96);
              auVar112 = vaddss_avx512f(auVar107,auVar112);
              auVar112 = vfmadd231ss_fma(auVar112,local_910,ZEXT416(0x36000000));
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar104 = vandps_avx512vl(ZEXT416((uint)fVar200),auVar35);
            } while (auVar112._0_4_ <= auVar104._0_4_);
            fVar185 = auVar102._0_4_ + (float)local_920._0_4_;
            if (fVar169 <= fVar185) {
              auVar112 = vucomiss_avx512f(ZEXT416((uint)fVar185));
              if (fVar169 <= fVar185) {
                auVar102 = vmovshdup_avx(auVar102);
                fVar198 = auVar102._0_4_;
                if ((0.0 <= fVar198) && (fVar198 <= 1.0)) {
                  auVar102 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_ac0._0_4_));
                  fVar200 = auVar102._0_4_;
                  lVar93 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar184 * 8);
                  if ((*(uint *)(lVar93 + 0x34) &
                      (uint)pre->ray_space[10].vz.field_0.m128[(long)ray]) != 0) {
                    fVar200 = fVar200 * 1.5 +
                              (float)local_ac0._0_4_ * -0.5 * fVar200 * fVar200 * fVar200;
                    local_b20 = auVar103._0_4_;
                    fStack_b1c = auVar103._4_4_;
                    fStack_b18 = auVar103._8_4_;
                    fStack_b14 = auVar103._12_4_;
                    auVar240._0_4_ = fVar200 * local_b20;
                    auVar240._4_4_ = fVar200 * fStack_b1c;
                    auVar240._8_4_ = fVar200 * fStack_b18;
                    auVar240._12_4_ = fVar200 * fStack_b14;
                    auVar100 = vfmadd213ps_fma(auVar100,auVar240,auVar99);
                    auVar102 = vshufps_avx(auVar240,auVar240,0xc9);
                    auVar103 = vshufps_avx(auVar99,auVar99,0xc9);
                    auVar241._0_4_ = auVar240._0_4_ * auVar103._0_4_;
                    auVar241._4_4_ = auVar240._4_4_ * auVar103._4_4_;
                    auVar241._8_4_ = auVar240._8_4_ * auVar103._8_4_;
                    auVar241._12_4_ = auVar240._12_4_ * auVar103._12_4_;
                    auVar104 = vfmsub231ps_fma(auVar241,auVar99,auVar102);
                    auVar102 = vshufps_avx(auVar104,auVar104,0xc9);
                    auVar103 = vshufps_avx(auVar100,auVar100,0xc9);
                    auVar104 = vshufps_avx(auVar104,auVar104,0xd2);
                    auVar176._0_4_ = auVar100._0_4_ * auVar104._0_4_;
                    auVar176._4_4_ = auVar100._4_4_ * auVar104._4_4_;
                    auVar176._8_4_ = auVar100._8_4_ * auVar104._8_4_;
                    auVar176._12_4_ = auVar100._12_4_ * auVar104._12_4_;
                    auVar102 = vfmsub231ps_fma(auVar176,auVar102,auVar103);
                    if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) &&
                       (*(long *)(lVar93 + 0x40) == 0)) {
                      pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                      fVar185 = (float)vextractps_avx(auVar102,1);
                      pre->ray_space[0xe].vz.field_0.m128[(long)ray] = fVar185;
                      uVar187 = vextractps_avx(auVar102,2);
                      *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x40) = uVar187;
                      pre[1].ray_space[0].vx.field_0.m128[(long)ray] = auVar102._0_4_;
                      pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar198;
                      pre[1].ray_space[2].vz.field_0.m128[(long)ray] = 0.0;
                      pre[1].ray_space[4].vx.field_0.m128[(long)ray] = fVar277;
                      pre[1].ray_space[5].vy.field_0.m128[(long)ray] = fVar184;
                      pre[1].ray_space[6].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                      pre[1].ray_space[8].vx.field_0.m128[(long)ray] =
                           *(float *)(*(long *)(k + 8) + 4);
                    }
                    else {
                      puVar6 = *(uint **)(k + 8);
                      auVar280 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar280,auVar183);
                      local_400 = vpermps_avx512f(auVar280,ZEXT1664(auVar102));
                      auVar183 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar183,ZEXT1664(auVar102));
                      local_380 = vbroadcastss_avx512f(auVar102);
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar183 = vmovdqa64_avx512f(local_440);
                      local_280 = vmovdqa64_avx512f(auVar183);
                      auVar126 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                      local_aa0[3] = auVar126;
                      local_aa0[2] = auVar126;
                      local_aa0[1] = auVar126;
                      *local_aa0 = auVar126;
                      local_240 = vbroadcastss_avx512f(ZEXT416(*puVar6));
                      local_200 = vbroadcastss_avx512f(ZEXT416(puVar6[1]));
                      pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar185;
                      auVar183 = vmovdqa64_avx512f(local_4c0);
                      local_6c0 = vmovdqa64_avx512f(auVar183);
                      local_af0 = local_6c0;
                      local_ae8 = *(undefined8 *)(lVar93 + 0x18);
                      local_ae0 = *(undefined8 *)(k + 8);
                      local_ad0 = (int *)local_400;
                      local_ac8 = 0x10;
                      local_8c0._0_4_ = auVar112._0_4_;
                      local_ad8 = pre;
                      uVar187 = auVar112._0_4_;
                      if (*(code **)(lVar93 + 0x40) != (code *)0x0) {
                        auVar278 = ZEXT1664(auVar99);
                        (**(code **)(lVar93 + 0x40))(&local_af0);
                        auVar270 = ZEXT3264(local_a80);
                        auVar267 = ZEXT3264(local_a00);
                        auVar260 = ZEXT3264(local_9e0);
                        auVar265 = ZEXT3264(local_9c0);
                        auVar275 = ZEXT3264(local_a60);
                        auVar273 = ZEXT3264(local_a40);
                        auVar268 = ZEXT3264(local_a20);
                        auVar183 = vmovdqa64_avx512f(local_6c0);
                        uVar187 = local_8c0._0_4_;
                      }
                      uVar22 = vptestmd_avx512f(auVar183,auVar183);
                      if ((short)uVar22 != 0) {
                        pcVar7 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                        if ((pcVar7 != (code *)0x0) &&
                           (((**(byte **)(k + 0x10) & 2) != 0 ||
                            ((*(byte *)(lVar93 + 0x3e) & 0x40) != 0)))) {
                          auVar278 = ZEXT1664(auVar278._0_16_);
                          (*pcVar7)(&local_af0);
                          auVar270 = ZEXT3264(local_a80);
                          auVar267 = ZEXT3264(local_a00);
                          auVar260 = ZEXT3264(local_9e0);
                          auVar265 = ZEXT3264(local_9c0);
                          auVar275 = ZEXT3264(local_a60);
                          auVar273 = ZEXT3264(local_a40);
                          auVar268 = ZEXT3264(local_a20);
                          auVar183 = vmovdqa64_avx512f(local_6c0);
                          uVar187 = local_8c0._0_4_;
                        }
                        uVar97 = vptestmd_avx512f(auVar183,auVar183);
                        if ((short)uVar97 != 0) {
                          iVar3 = local_ad0[1];
                          iVar4 = local_ad0[2];
                          iVar1 = local_ad0[3];
                          iVar54 = local_ad0[4];
                          iVar55 = local_ad0[5];
                          iVar56 = local_ad0[6];
                          iVar57 = local_ad0[7];
                          iVar58 = local_ad0[8];
                          iVar59 = local_ad0[9];
                          iVar60 = local_ad0[10];
                          iVar61 = local_ad0[0xb];
                          iVar62 = local_ad0[0xc];
                          iVar63 = local_ad0[0xd];
                          iVar64 = local_ad0[0xe];
                          iVar65 = local_ad0[0xf];
                          pVVar5 = &local_ad8->ray_space[0xe].vz;
                          iVar66 = *(int *)((long)&local_ad8->ray_space[0xe].vz.field_0 + 4);
                          iVar67 = *(int *)((long)&local_ad8->ray_space[0xe].vz.field_0 + 8);
                          iVar68 = *(int *)((long)&local_ad8->ray_space[0xe].vz.field_0 + 0xc);
                          iVar69 = *(int *)&local_ad8->ray_space[0xf].vx.field_0;
                          iVar70 = *(int *)((long)&local_ad8->ray_space[0xf].vx.field_0 + 4);
                          iVar71 = *(int *)((long)&local_ad8->ray_space[0xf].vx.field_0 + 8);
                          iVar72 = *(int *)((long)&local_ad8->ray_space[0xf].vx.field_0 + 0xc);
                          iVar73 = *(int *)&local_ad8->ray_space[0xf].vy.field_0;
                          iVar74 = *(int *)((long)&local_ad8->ray_space[0xf].vy.field_0 + 4);
                          iVar75 = *(int *)((long)&local_ad8->ray_space[0xf].vy.field_0 + 8);
                          iVar76 = *(int *)((long)&local_ad8->ray_space[0xf].vy.field_0 + 0xc);
                          iVar77 = *(int *)&local_ad8->ray_space[0xf].vz.field_0;
                          iVar78 = *(int *)((long)&local_ad8->ray_space[0xf].vz.field_0 + 4);
                          iVar79 = *(int *)((long)&local_ad8->ray_space[0xf].vz.field_0 + 8);
                          iVar80 = *(int *)((long)&local_ad8->ray_space[0xf].vz.field_0 + 0xc);
                          bVar85 = (byte)uVar97;
                          bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                          bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                          bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                          bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                          bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                          bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                          bVar87 = (byte)(uVar97 >> 8);
                          bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                          bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                          bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                          bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                          bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                          bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                          bVar20 = SUB81(uVar97 >> 0xf,0);
                          (pVVar5->field_0).m128[0] =
                               (float)((uint)(bVar85 & 1) * *local_ad0 |
                                      (uint)!(bool)(bVar85 & 1) * *(int *)&pVVar5->field_0);
                          local_ad8->ray_space[0xe].vz.field_0.m128[1] =
                               (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                          local_ad8->ray_space[0xe].vz.field_0.m128[2] =
                               (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                          local_ad8->ray_space[0xe].vz.field_0.m128[3] =
                               (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                          local_ad8->ray_space[0xf].vx.field_0.m128[0] =
                               (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                          local_ad8->ray_space[0xf].vx.field_0.m128[1] =
                               (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                          local_ad8->ray_space[0xf].vx.field_0.m128[2] =
                               (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                          local_ad8->ray_space[0xf].vx.field_0.m128[3] =
                               (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                          local_ad8->ray_space[0xf].vy.field_0.m128[0] =
                               (float)((uint)(bVar87 & 1) * iVar58 |
                                      (uint)!(bool)(bVar87 & 1) * iVar73);
                          local_ad8->ray_space[0xf].vy.field_0.m128[1] =
                               (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                          local_ad8->ray_space[0xf].vy.field_0.m128[2] =
                               (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                          local_ad8->ray_space[0xf].vy.field_0.m128[3] =
                               (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                          local_ad8->ray_space[0xf].vz.field_0.m128[0] =
                               (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                          local_ad8->ray_space[0xf].vz.field_0.m128[1] =
                               (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                          local_ad8->ray_space[0xf].vz.field_0.m128[2] =
                               (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                          local_ad8->ray_space[0xf].vz.field_0.m128[3] =
                               (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                          iVar3 = local_ad0[0x11];
                          iVar4 = local_ad0[0x12];
                          iVar1 = local_ad0[0x13];
                          iVar54 = local_ad0[0x14];
                          iVar55 = local_ad0[0x15];
                          iVar56 = local_ad0[0x16];
                          iVar57 = local_ad0[0x17];
                          iVar58 = local_ad0[0x18];
                          iVar59 = local_ad0[0x19];
                          iVar60 = local_ad0[0x1a];
                          iVar61 = local_ad0[0x1b];
                          iVar62 = local_ad0[0x1c];
                          iVar63 = local_ad0[0x1d];
                          iVar64 = local_ad0[0x1e];
                          iVar65 = local_ad0[0x1f];
                          iVar66 = local_ad8[1].depth_scale.field_0.i[1];
                          iVar67 = local_ad8[1].depth_scale.field_0.i[2];
                          iVar68 = local_ad8[1].depth_scale.field_0.i[3];
                          iVar69 = local_ad8[1].depth_scale.field_0.i[4];
                          iVar70 = local_ad8[1].depth_scale.field_0.i[5];
                          iVar71 = local_ad8[1].depth_scale.field_0.i[6];
                          iVar72 = local_ad8[1].depth_scale.field_0.i[7];
                          iVar73 = local_ad8[1].depth_scale.field_0.i[8];
                          iVar74 = local_ad8[1].depth_scale.field_0.i[9];
                          iVar75 = local_ad8[1].depth_scale.field_0.i[10];
                          iVar76 = local_ad8[1].depth_scale.field_0.i[0xb];
                          iVar77 = local_ad8[1].depth_scale.field_0.i[0xc];
                          iVar78 = local_ad8[1].depth_scale.field_0.i[0xd];
                          iVar79 = local_ad8[1].depth_scale.field_0.i[0xe];
                          iVar80 = local_ad8[1].depth_scale.field_0.i[0xf];
                          bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                          bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                          bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                          bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                          bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                          bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                          bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                          bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                          bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                          bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                          bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                          bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                          bVar20 = SUB81(uVar97 >> 0xf,0);
                          local_ad8[1].depth_scale.field_0.i[0] =
                               (uint)(bVar85 & 1) * local_ad0[0x10] |
                               (uint)!(bool)(bVar85 & 1) * local_ad8[1].depth_scale.field_0.i[0];
                          local_ad8[1].depth_scale.field_0.i[1] =
                               (uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66;
                          local_ad8[1].depth_scale.field_0.i[2] =
                               (uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67;
                          local_ad8[1].depth_scale.field_0.i[3] =
                               (uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68;
                          local_ad8[1].depth_scale.field_0.i[4] =
                               (uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69;
                          local_ad8[1].depth_scale.field_0.i[5] =
                               (uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70;
                          local_ad8[1].depth_scale.field_0.i[6] =
                               (uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71;
                          local_ad8[1].depth_scale.field_0.i[7] =
                               (uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72;
                          local_ad8[1].depth_scale.field_0.i[8] =
                               (uint)(bVar87 & 1) * iVar58 | (uint)!(bool)(bVar87 & 1) * iVar73;
                          local_ad8[1].depth_scale.field_0.i[9] =
                               (uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74;
                          local_ad8[1].depth_scale.field_0.i[10] =
                               (uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75;
                          local_ad8[1].depth_scale.field_0.i[0xb] =
                               (uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76;
                          local_ad8[1].depth_scale.field_0.i[0xc] =
                               (uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77;
                          local_ad8[1].depth_scale.field_0.i[0xd] =
                               (uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78;
                          local_ad8[1].depth_scale.field_0.i[0xe] =
                               (uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79;
                          local_ad8[1].depth_scale.field_0.i[0xf] =
                               (uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80;
                          iVar3 = local_ad0[0x21];
                          iVar4 = local_ad0[0x22];
                          iVar1 = local_ad0[0x23];
                          iVar54 = local_ad0[0x24];
                          iVar55 = local_ad0[0x25];
                          iVar56 = local_ad0[0x26];
                          iVar57 = local_ad0[0x27];
                          iVar58 = local_ad0[0x28];
                          iVar59 = local_ad0[0x29];
                          iVar60 = local_ad0[0x2a];
                          iVar61 = local_ad0[0x2b];
                          iVar62 = local_ad0[0x2c];
                          iVar63 = local_ad0[0x2d];
                          iVar64 = local_ad0[0x2e];
                          iVar65 = local_ad0[0x2f];
                          iVar66 = *(int *)((long)&local_ad8[1].ray_space[0].vx.field_0 + 4);
                          iVar67 = *(int *)((long)&local_ad8[1].ray_space[0].vx.field_0 + 8);
                          iVar68 = *(int *)((long)&local_ad8[1].ray_space[0].vx.field_0 + 0xc);
                          iVar69 = *(int *)&local_ad8[1].ray_space[0].vy.field_0;
                          iVar70 = *(int *)((long)&local_ad8[1].ray_space[0].vy.field_0 + 4);
                          iVar71 = *(int *)((long)&local_ad8[1].ray_space[0].vy.field_0 + 8);
                          iVar72 = *(int *)((long)&local_ad8[1].ray_space[0].vy.field_0 + 0xc);
                          iVar73 = *(int *)&local_ad8[1].ray_space[0].vz.field_0;
                          iVar74 = *(int *)((long)&local_ad8[1].ray_space[0].vz.field_0 + 4);
                          iVar75 = *(int *)((long)&local_ad8[1].ray_space[0].vz.field_0 + 8);
                          iVar76 = *(int *)((long)&local_ad8[1].ray_space[0].vz.field_0 + 0xc);
                          iVar77 = *(int *)&local_ad8[1].ray_space[1].vx.field_0;
                          iVar78 = *(int *)((long)&local_ad8[1].ray_space[1].vx.field_0 + 4);
                          iVar79 = *(int *)((long)&local_ad8[1].ray_space[1].vx.field_0 + 8);
                          iVar80 = *(int *)((long)&local_ad8[1].ray_space[1].vx.field_0 + 0xc);
                          bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                          bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                          bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                          bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                          bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                          bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                          bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                          bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                          bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                          bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                          bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                          bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                          bVar20 = SUB81(uVar97 >> 0xf,0);
                          local_ad8[1].ray_space[0].vx.field_0.m128[0] =
                               (float)((uint)(bVar85 & 1) * local_ad0[0x20] |
                                      (uint)!(bool)(bVar85 & 1) *
                                      *(int *)&local_ad8[1].ray_space[0].vx.field_0);
                          local_ad8[1].ray_space[0].vx.field_0.m128[1] =
                               (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                          local_ad8[1].ray_space[0].vx.field_0.m128[2] =
                               (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                          local_ad8[1].ray_space[0].vx.field_0.m128[3] =
                               (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                          local_ad8[1].ray_space[0].vy.field_0.m128[0] =
                               (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                          local_ad8[1].ray_space[0].vy.field_0.m128[1] =
                               (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                          local_ad8[1].ray_space[0].vy.field_0.m128[2] =
                               (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                          local_ad8[1].ray_space[0].vy.field_0.m128[3] =
                               (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                          local_ad8[1].ray_space[0].vz.field_0.m128[0] =
                               (float)((uint)(bVar87 & 1) * iVar58 |
                                      (uint)!(bool)(bVar87 & 1) * iVar73);
                          local_ad8[1].ray_space[0].vz.field_0.m128[1] =
                               (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                          local_ad8[1].ray_space[0].vz.field_0.m128[2] =
                               (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                          local_ad8[1].ray_space[0].vz.field_0.m128[3] =
                               (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                          local_ad8[1].ray_space[1].vx.field_0.m128[0] =
                               (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                          local_ad8[1].ray_space[1].vx.field_0.m128[1] =
                               (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                          local_ad8[1].ray_space[1].vx.field_0.m128[2] =
                               (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                          local_ad8[1].ray_space[1].vx.field_0.m128[3] =
                               (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                          iVar3 = local_ad0[0x31];
                          iVar4 = local_ad0[0x32];
                          iVar1 = local_ad0[0x33];
                          iVar54 = local_ad0[0x34];
                          iVar55 = local_ad0[0x35];
                          iVar56 = local_ad0[0x36];
                          iVar57 = local_ad0[0x37];
                          iVar58 = local_ad0[0x38];
                          iVar59 = local_ad0[0x39];
                          iVar60 = local_ad0[0x3a];
                          iVar61 = local_ad0[0x3b];
                          iVar62 = local_ad0[0x3c];
                          iVar63 = local_ad0[0x3d];
                          iVar64 = local_ad0[0x3e];
                          iVar65 = local_ad0[0x3f];
                          pVVar5 = &local_ad8[1].ray_space[1].vy;
                          iVar66 = *(int *)((long)&local_ad8[1].ray_space[1].vy.field_0 + 4);
                          iVar67 = *(int *)((long)&local_ad8[1].ray_space[1].vy.field_0 + 8);
                          iVar68 = *(int *)((long)&local_ad8[1].ray_space[1].vy.field_0 + 0xc);
                          iVar69 = *(int *)&local_ad8[1].ray_space[1].vz.field_0;
                          iVar70 = *(int *)((long)&local_ad8[1].ray_space[1].vz.field_0 + 4);
                          iVar71 = *(int *)((long)&local_ad8[1].ray_space[1].vz.field_0 + 8);
                          iVar72 = *(int *)((long)&local_ad8[1].ray_space[1].vz.field_0 + 0xc);
                          iVar73 = *(int *)&local_ad8[1].ray_space[2].vx.field_0;
                          iVar74 = *(int *)((long)&local_ad8[1].ray_space[2].vx.field_0 + 4);
                          iVar75 = *(int *)((long)&local_ad8[1].ray_space[2].vx.field_0 + 8);
                          iVar76 = *(int *)((long)&local_ad8[1].ray_space[2].vx.field_0 + 0xc);
                          iVar77 = *(int *)&local_ad8[1].ray_space[2].vy.field_0;
                          iVar78 = *(int *)((long)&local_ad8[1].ray_space[2].vy.field_0 + 4);
                          iVar79 = *(int *)((long)&local_ad8[1].ray_space[2].vy.field_0 + 8);
                          iVar80 = *(int *)((long)&local_ad8[1].ray_space[2].vy.field_0 + 0xc);
                          bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                          bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                          bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                          bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                          bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                          bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                          bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                          bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                          bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                          bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                          bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                          bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                          bVar20 = SUB81(uVar97 >> 0xf,0);
                          (pVVar5->field_0).m128[0] =
                               (float)((uint)(bVar85 & 1) * local_ad0[0x30] |
                                      (uint)!(bool)(bVar85 & 1) * *(int *)&pVVar5->field_0);
                          local_ad8[1].ray_space[1].vy.field_0.m128[1] =
                               (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                          local_ad8[1].ray_space[1].vy.field_0.m128[2] =
                               (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                          local_ad8[1].ray_space[1].vy.field_0.m128[3] =
                               (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                          local_ad8[1].ray_space[1].vz.field_0.m128[0] =
                               (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                          local_ad8[1].ray_space[1].vz.field_0.m128[1] =
                               (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                          local_ad8[1].ray_space[1].vz.field_0.m128[2] =
                               (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                          local_ad8[1].ray_space[1].vz.field_0.m128[3] =
                               (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                          local_ad8[1].ray_space[2].vx.field_0.m128[0] =
                               (float)((uint)(bVar87 & 1) * iVar58 |
                                      (uint)!(bool)(bVar87 & 1) * iVar73);
                          local_ad8[1].ray_space[2].vx.field_0.m128[1] =
                               (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                          local_ad8[1].ray_space[2].vx.field_0.m128[2] =
                               (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                          local_ad8[1].ray_space[2].vx.field_0.m128[3] =
                               (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                          local_ad8[1].ray_space[2].vy.field_0.m128[0] =
                               (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                          local_ad8[1].ray_space[2].vy.field_0.m128[1] =
                               (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                          local_ad8[1].ray_space[2].vy.field_0.m128[2] =
                               (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                          local_ad8[1].ray_space[2].vy.field_0.m128[3] =
                               (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                          iVar3 = local_ad0[0x41];
                          iVar4 = local_ad0[0x42];
                          iVar1 = local_ad0[0x43];
                          iVar54 = local_ad0[0x44];
                          iVar55 = local_ad0[0x45];
                          iVar56 = local_ad0[0x46];
                          iVar57 = local_ad0[0x47];
                          iVar58 = local_ad0[0x48];
                          iVar59 = local_ad0[0x49];
                          iVar60 = local_ad0[0x4a];
                          iVar61 = local_ad0[0x4b];
                          iVar62 = local_ad0[0x4c];
                          iVar63 = local_ad0[0x4d];
                          iVar64 = local_ad0[0x4e];
                          iVar65 = local_ad0[0x4f];
                          pVVar5 = &local_ad8[1].ray_space[2].vz;
                          iVar66 = *(int *)((long)&local_ad8[1].ray_space[2].vz.field_0 + 4);
                          iVar67 = *(int *)((long)&local_ad8[1].ray_space[2].vz.field_0 + 8);
                          iVar68 = *(int *)((long)&local_ad8[1].ray_space[2].vz.field_0 + 0xc);
                          iVar69 = *(int *)&local_ad8[1].ray_space[3].vx.field_0;
                          iVar70 = *(int *)((long)&local_ad8[1].ray_space[3].vx.field_0 + 4);
                          iVar71 = *(int *)((long)&local_ad8[1].ray_space[3].vx.field_0 + 8);
                          iVar72 = *(int *)((long)&local_ad8[1].ray_space[3].vx.field_0 + 0xc);
                          iVar73 = *(int *)&local_ad8[1].ray_space[3].vy.field_0;
                          iVar74 = *(int *)((long)&local_ad8[1].ray_space[3].vy.field_0 + 4);
                          iVar75 = *(int *)((long)&local_ad8[1].ray_space[3].vy.field_0 + 8);
                          iVar76 = *(int *)((long)&local_ad8[1].ray_space[3].vy.field_0 + 0xc);
                          iVar77 = *(int *)&local_ad8[1].ray_space[3].vz.field_0;
                          iVar78 = *(int *)((long)&local_ad8[1].ray_space[3].vz.field_0 + 4);
                          iVar79 = *(int *)((long)&local_ad8[1].ray_space[3].vz.field_0 + 8);
                          iVar80 = *(int *)((long)&local_ad8[1].ray_space[3].vz.field_0 + 0xc);
                          bVar94 = (bool)((byte)(uVar97 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar97 >> 2) & 1);
                          bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                          bVar10 = (bool)((byte)(uVar97 >> 4) & 1);
                          bVar11 = (bool)((byte)(uVar97 >> 5) & 1);
                          bVar12 = (bool)((byte)(uVar97 >> 6) & 1);
                          bVar13 = (bool)((byte)(uVar97 >> 7) & 1);
                          bVar14 = (bool)((byte)(uVar97 >> 9) & 1);
                          bVar15 = (bool)((byte)(uVar97 >> 10) & 1);
                          bVar16 = (bool)((byte)(uVar97 >> 0xb) & 1);
                          bVar17 = (bool)((byte)(uVar97 >> 0xc) & 1);
                          bVar18 = (bool)((byte)(uVar97 >> 0xd) & 1);
                          bVar19 = (bool)((byte)(uVar97 >> 0xe) & 1);
                          bVar20 = SUB81(uVar97 >> 0xf,0);
                          (pVVar5->field_0).m128[0] =
                               (float)((uint)(bVar85 & 1) * local_ad0[0x40] |
                                      (uint)!(bool)(bVar85 & 1) * *(int *)&pVVar5->field_0);
                          local_ad8[1].ray_space[2].vz.field_0.m128[1] =
                               (float)((uint)bVar94 * iVar3 | (uint)!bVar94 * iVar66);
                          local_ad8[1].ray_space[2].vz.field_0.m128[2] =
                               (float)((uint)bVar8 * iVar4 | (uint)!bVar8 * iVar67);
                          local_ad8[1].ray_space[2].vz.field_0.m128[3] =
                               (float)((uint)bVar9 * iVar1 | (uint)!bVar9 * iVar68);
                          local_ad8[1].ray_space[3].vx.field_0.m128[0] =
                               (float)((uint)bVar10 * iVar54 | (uint)!bVar10 * iVar69);
                          local_ad8[1].ray_space[3].vx.field_0.m128[1] =
                               (float)((uint)bVar11 * iVar55 | (uint)!bVar11 * iVar70);
                          local_ad8[1].ray_space[3].vx.field_0.m128[2] =
                               (float)((uint)bVar12 * iVar56 | (uint)!bVar12 * iVar71);
                          local_ad8[1].ray_space[3].vx.field_0.m128[3] =
                               (float)((uint)bVar13 * iVar57 | (uint)!bVar13 * iVar72);
                          local_ad8[1].ray_space[3].vy.field_0.m128[0] =
                               (float)((uint)(bVar87 & 1) * iVar58 |
                                      (uint)!(bool)(bVar87 & 1) * iVar73);
                          local_ad8[1].ray_space[3].vy.field_0.m128[1] =
                               (float)((uint)bVar14 * iVar59 | (uint)!bVar14 * iVar74);
                          local_ad8[1].ray_space[3].vy.field_0.m128[2] =
                               (float)((uint)bVar15 * iVar60 | (uint)!bVar15 * iVar75);
                          local_ad8[1].ray_space[3].vy.field_0.m128[3] =
                               (float)((uint)bVar16 * iVar61 | (uint)!bVar16 * iVar76);
                          local_ad8[1].ray_space[3].vz.field_0.m128[0] =
                               (float)((uint)bVar17 * iVar62 | (uint)!bVar17 * iVar77);
                          local_ad8[1].ray_space[3].vz.field_0.m128[1] =
                               (float)((uint)bVar18 * iVar63 | (uint)!bVar18 * iVar78);
                          local_ad8[1].ray_space[3].vz.field_0.m128[2] =
                               (float)((uint)bVar19 * iVar64 | (uint)!bVar19 * iVar79);
                          local_ad8[1].ray_space[3].vz.field_0.m128[3] =
                               (float)((uint)bVar20 * iVar65 | (uint)!bVar20 * iVar80);
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x50));
                          auVar183 = vmovdqu32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_ad8[1].ray_space + 4) = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x60));
                          auVar183 = vmovdqu32_avx512f(auVar183);
                          *(undefined1 (*) [64])&local_ad8[1].ray_space[5].vy = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x70));
                          auVar183 = vmovdqa32_avx512f(auVar183);
                          *(undefined1 (*) [64])&local_ad8[1].ray_space[6].vz = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0 + 0x80));
                          auVar183 = vmovdqa32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_ad8[1].ray_space + 8) = auVar183;
                          goto LAB_019abb9c;
                        }
                      }
                      *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4) = uVar187
                      ;
                    }
                  }
                }
              }
            }
LAB_019abb9c:
            uVar187 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
            auVar256._4_4_ = uVar187;
            auVar256._0_4_ = uVar187;
            auVar256._8_4_ = uVar187;
            auVar256._12_4_ = uVar187;
            auVar256._16_4_ = uVar187;
            auVar256._20_4_ = uVar187;
            auVar256._24_4_ = uVar187;
            auVar256._28_4_ = uVar187;
            auVar183 = ZEXT3264(auVar256);
            auVar82._4_4_ = fStack_65c;
            auVar82._0_4_ = local_660;
            auVar82._8_4_ = fStack_658;
            auVar82._12_4_ = fStack_654;
            auVar82._16_4_ = fStack_650;
            auVar82._20_4_ = fStack_64c;
            auVar82._24_4_ = fStack_648;
            auVar82._28_4_ = fStack_644;
            uVar22 = vcmpps_avx512vl(auVar256,auVar82,0xd);
          }
          uVar24 = vpcmpd_avx512vl(local_620,local_5c0,1);
          uVar23 = vpcmpd_avx512vl(local_620,_local_680,1);
          auVar195._0_4_ = (float)local_960._0_4_ + (float)local_540._0_4_;
          auVar195._4_4_ = (float)local_960._4_4_ + (float)local_540._4_4_;
          auVar195._8_4_ = fStack_958 + fStack_538;
          auVar195._12_4_ = fStack_954 + fStack_534;
          auVar195._16_4_ = fStack_950 + fStack_530;
          auVar195._20_4_ = fStack_94c + fStack_52c;
          auVar195._24_4_ = fStack_948 + fStack_528;
          auVar195._28_4_ = fStack_944 + fStack_524;
          uVar187 = auVar183._0_4_;
          auVar226._4_4_ = uVar187;
          auVar226._0_4_ = uVar187;
          auVar226._8_4_ = uVar187;
          auVar226._12_4_ = uVar187;
          auVar226._16_4_ = uVar187;
          auVar226._20_4_ = uVar187;
          auVar226._24_4_ = uVar187;
          auVar226._28_4_ = uVar187;
          uVar22 = vcmpps_avx512vl(auVar195,auVar226,2);
          bVar90 = bVar90 & (byte)uVar24 & (byte)uVar22;
          auVar243._0_4_ = (float)local_960._0_4_ + (float)local_600._0_4_;
          auVar243._4_4_ = (float)local_960._4_4_ + (float)local_600._4_4_;
          auVar243._8_4_ = fStack_958 + fStack_5f8;
          auVar243._12_4_ = fStack_954 + fStack_5f4;
          auVar243._16_4_ = fStack_950 + fStack_5f0;
          auVar243._20_4_ = fStack_94c + fStack_5ec;
          auVar243._24_4_ = fStack_948 + fStack_5e8;
          auVar243._28_4_ = fStack_944 + fStack_5e4;
          uVar22 = vcmpps_avx512vl(auVar243,auVar226,2);
          bVar84 = bVar84 & (byte)uVar23 & (byte)uVar22 | bVar90;
          if (bVar84 != 0) {
            abStack_1a0[uVar88 * 0x60] = bVar84;
            bVar94 = (bool)(bVar90 >> 1 & 1);
            bVar8 = (bool)(bVar90 >> 2 & 1);
            bVar9 = (bool)(bVar90 >> 3 & 1);
            bVar10 = (bool)(bVar90 >> 4 & 1);
            bVar11 = (bool)(bVar90 >> 5 & 1);
            auStack_180[uVar88 * 0x18] =
                 (uint)(bVar90 & 1) * local_540._0_4_ | (uint)!(bool)(bVar90 & 1) * local_600._0_4_;
            auStack_180[uVar88 * 0x18 + 1] =
                 (uint)bVar94 * local_540._4_4_ | (uint)!bVar94 * local_600._4_4_;
            auStack_180[uVar88 * 0x18 + 2] =
                 (uint)bVar8 * (int)fStack_538 | (uint)!bVar8 * (int)fStack_5f8;
            auStack_180[uVar88 * 0x18 + 3] =
                 (uint)bVar9 * (int)fStack_534 | (uint)!bVar9 * (int)fStack_5f4;
            auStack_180[uVar88 * 0x18 + 4] =
                 (uint)bVar10 * (int)fStack_530 | (uint)!bVar10 * (int)fStack_5f0;
            auStack_180[uVar88 * 0x18 + 5] =
                 (uint)bVar11 * (int)fStack_52c | (uint)!bVar11 * (int)fStack_5ec;
            auStack_180[uVar88 * 0x18 + 6] =
                 (uint)(bVar90 >> 6) * (int)fStack_528 |
                 (uint)!(bool)(bVar90 >> 6) * (int)fStack_5e8;
            (&fStack_164)[uVar88 * 0x18] = fStack_5e4;
            uVar97 = vmovlps_avx(local_630);
            (&uStack_160)[uVar88 * 0xc] = uVar97;
            aiStack_158[uVar88 * 0x18] = iVar91 + 1;
            uVar88 = (ulong)((int)uVar88 + 1);
          }
          auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar280 = ZEXT3264(auVar126);
          auVar183 = ZEXT3264(_DAT_01f7b040);
          lVar93 = local_a98;
          context = local_a90;
          fVar185 = (float)local_960._0_4_;
          fVar198 = (float)local_960._4_4_;
          fVar200 = fStack_958;
          fVar202 = fStack_954;
          fVar170 = fStack_950;
          fVar228 = fStack_94c;
          fVar205 = fStack_948;
          fVar207 = fStack_944;
        }
      }
    }
    do {
      uVar98 = (uint)uVar88;
      uVar88 = (ulong)(uVar98 - 1);
      if (uVar98 == 0) {
        uVar187 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
        auVar41._4_4_ = uVar187;
        auVar41._0_4_ = uVar187;
        auVar41._8_4_ = uVar187;
        auVar41._12_4_ = uVar187;
        auVar41._16_4_ = uVar187;
        auVar41._20_4_ = uVar187;
        auVar41._24_4_ = uVar187;
        auVar41._28_4_ = uVar187;
        uVar22 = vcmpps_avx512vl(local_5a0,auVar41,2);
        local_a88 = (ulong)((uint)local_a88 & (uint)uVar22);
        goto LAB_019a9727;
      }
      auVar126 = *(undefined1 (*) [32])(auStack_180 + uVar88 * 0x18);
      auVar196._0_4_ = fVar185 + auVar126._0_4_;
      auVar196._4_4_ = fVar198 + auVar126._4_4_;
      auVar196._8_4_ = fVar200 + auVar126._8_4_;
      auVar196._12_4_ = fVar202 + auVar126._12_4_;
      auVar196._16_4_ = fVar170 + auVar126._16_4_;
      auVar196._20_4_ = fVar228 + auVar126._20_4_;
      auVar196._24_4_ = fVar205 + auVar126._24_4_;
      auVar196._28_4_ = fVar207 + auVar126._28_4_;
      uVar187 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
      auVar40._4_4_ = uVar187;
      auVar40._0_4_ = uVar187;
      auVar40._8_4_ = uVar187;
      auVar40._12_4_ = uVar187;
      auVar40._16_4_ = uVar187;
      auVar40._20_4_ = uVar187;
      auVar40._24_4_ = uVar187;
      auVar40._28_4_ = uVar187;
      uVar22 = vcmpps_avx512vl(auVar196,auVar40,2);
      uVar162 = (uint)uVar22 & (uint)abStack_1a0[uVar88 * 0x60];
    } while (uVar162 == 0);
    uVar97 = (&uStack_160)[uVar88 * 0xc];
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar97;
    auVar227._8_4_ = 0x7f800000;
    auVar227._0_8_ = 0x7f8000007f800000;
    auVar227._12_4_ = 0x7f800000;
    auVar227._16_4_ = 0x7f800000;
    auVar227._20_4_ = 0x7f800000;
    auVar227._24_4_ = 0x7f800000;
    auVar227._28_4_ = 0x7f800000;
    auVar115 = vblendmps_avx512vl(auVar227,auVar126);
    bVar84 = (byte)uVar162;
    auVar161._0_4_ =
         (uint)(bVar84 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)auVar126._0_4_;
    bVar94 = (bool)((byte)(uVar162 >> 1) & 1);
    auVar161._4_4_ = (uint)bVar94 * auVar115._4_4_ | (uint)!bVar94 * (int)auVar126._4_4_;
    bVar94 = (bool)((byte)(uVar162 >> 2) & 1);
    auVar161._8_4_ = (uint)bVar94 * auVar115._8_4_ | (uint)!bVar94 * (int)auVar126._8_4_;
    bVar94 = (bool)((byte)(uVar162 >> 3) & 1);
    auVar161._12_4_ = (uint)bVar94 * auVar115._12_4_ | (uint)!bVar94 * (int)auVar126._12_4_;
    bVar94 = (bool)((byte)(uVar162 >> 4) & 1);
    auVar161._16_4_ = (uint)bVar94 * auVar115._16_4_ | (uint)!bVar94 * (int)auVar126._16_4_;
    bVar94 = (bool)((byte)(uVar162 >> 5) & 1);
    auVar161._20_4_ = (uint)bVar94 * auVar115._20_4_ | (uint)!bVar94 * (int)auVar126._20_4_;
    bVar94 = (bool)((byte)(uVar162 >> 6) & 1);
    auVar161._24_4_ = (uint)bVar94 * auVar115._24_4_ | (uint)!bVar94 * (int)auVar126._24_4_;
    auVar161._28_4_ =
         (uVar162 >> 7) * auVar115._28_4_ | (uint)!SUB41(uVar162 >> 7,0) * (int)auVar126._28_4_;
    auVar126 = vshufps_avx(auVar161,auVar161,0xb1);
    auVar126 = vminps_avx(auVar161,auVar126);
    auVar115 = vshufpd_avx(auVar126,auVar126,5);
    auVar126 = vminps_avx(auVar126,auVar115);
    auVar115 = vpermpd_avx2(auVar126,0x4e);
    auVar126 = vminps_avx(auVar126,auVar115);
    uVar22 = vcmpps_avx512vl(auVar161,auVar126,0);
    bVar92 = (byte)uVar22 & bVar84;
    if (bVar92 != 0) {
      uVar162 = (uint)bVar92;
    }
    uVar163 = 0;
    for (; (uVar162 & 1) == 0; uVar162 = uVar162 >> 1 | 0x80000000) {
      uVar163 = uVar163 + 1;
    }
    iVar91 = aiStack_158[uVar88 * 0x18];
    bVar84 = ~('\x01' << ((byte)uVar163 & 0x1f)) & bVar84;
    abStack_1a0[uVar88 * 0x60] = bVar84;
    if (bVar84 == 0) {
      uVar98 = uVar98 - 1;
    }
    uVar187 = (undefined4)uVar97;
    auVar182._4_4_ = uVar187;
    auVar182._0_4_ = uVar187;
    auVar182._8_4_ = uVar187;
    auVar182._12_4_ = uVar187;
    auVar182._16_4_ = uVar187;
    auVar182._20_4_ = uVar187;
    auVar182._24_4_ = uVar187;
    auVar182._28_4_ = uVar187;
    auVar102 = vmovshdup_avx(auVar110);
    auVar102 = vsubps_avx(auVar102,auVar110);
    auVar197._0_4_ = auVar102._0_4_;
    auVar197._4_4_ = auVar197._0_4_;
    auVar197._8_4_ = auVar197._0_4_;
    auVar197._12_4_ = auVar197._0_4_;
    auVar197._16_4_ = auVar197._0_4_;
    auVar197._20_4_ = auVar197._0_4_;
    auVar197._24_4_ = auVar197._0_4_;
    auVar197._28_4_ = auVar197._0_4_;
    auVar102 = vfmadd132ps_fma(auVar197,auVar182,auVar183._0_32_);
    local_400._0_32_ = ZEXT1632(auVar102);
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_400 + (ulong)uVar163 * 4);
    uVar88 = (ulong)uVar98;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }